

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Ref<embree::Geometry> *pRVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCIntersectArguments *pRVar11;
  RTCRayQueryContext *pRVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 (*pauVar62) [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar69;
  uint uVar70;
  AABBNodeMB4D *node1;
  ulong uVar71;
  long lVar72;
  long lVar73;
  ulong uVar74;
  ulong uVar75;
  int iVar76;
  undefined1 (*pauVar77) [16];
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  undefined1 (*pauVar82) [16];
  ulong uVar83;
  ulong uVar84;
  long lVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  long lVar93;
  ulong uVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar101;
  float fVar102;
  undefined1 auVar100 [64];
  float fVar103;
  float fVar104;
  undefined1 auVar105 [16];
  float fVar112;
  float fVar113;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar106 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  float fVar121;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar123;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar122;
  float fVar124;
  undefined1 auVar120 [32];
  float fVar125;
  float fVar137;
  float fVar139;
  undefined1 auVar126 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar127 [16];
  undefined1 auVar132 [32];
  float fVar140;
  undefined1 auVar133 [32];
  float fVar138;
  undefined1 auVar134 [32];
  undefined1 auVar128 [16];
  undefined1 auVar135 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar144;
  float fVar145;
  float fVar156;
  float fVar158;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar157;
  float fVar159;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar155 [64];
  undefined1 auVar165 [16];
  float fVar163;
  float fVar164;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar177;
  float fVar179;
  float fVar181;
  undefined1 auVar168 [32];
  float fVar170;
  float fVar172;
  float fVar176;
  float fVar178;
  float fVar180;
  undefined1 auVar169 [64];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar189;
  float fVar190;
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar192 [64];
  float fVar205;
  undefined1 auVar206 [32];
  float fVar216;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar209 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  float fVar219;
  undefined1 auVar220 [32];
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar221 [64];
  float fVar228;
  float fVar229;
  undefined1 auVar230 [32];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar231 [64];
  float fVar244;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar245 [64];
  undefined1 auVar252 [16];
  undefined1 auVar253 [64];
  float fVar254;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar255 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2a50) [16];
  int local_2a24;
  undefined1 local_2a20 [8];
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  Scene *local_2a00;
  RTCFilterFunctionNArguments local_29f8;
  ulong local_29c8;
  ulong local_29c0;
  ulong local_29b8;
  long local_29b0;
  ulong local_29a8;
  long local_29a0;
  ulong local_2998;
  long local_2990;
  ulong local_2988;
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  float local_2950;
  float local_294c;
  float local_2948;
  undefined4 local_2944;
  undefined4 local_2940;
  undefined4 local_293c;
  uint local_2938;
  uint local_2934;
  uint local_2930;
  float local_2920;
  float fStack_291c;
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  float fStack_2904;
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  undefined1 auStack_28b0 [16];
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  undefined1 local_2880 [8];
  float fStack_2878;
  float fStack_2874;
  undefined4 uStack_2864;
  undefined1 local_2860 [32];
  undefined1 local_2840 [8];
  float fStack_2838;
  float fStack_2834;
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  undefined4 uStack_2804;
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  undefined1 local_2750 [8];
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  undefined1 local_2730 [8];
  float fStack_2728;
  float fStack_2724;
  undefined1 local_2720 [8];
  float fStack_2718;
  float fStack_2714;
  undefined1 local_2710 [8];
  float fStack_2708;
  float fStack_2704;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  float local_2560 [4];
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  undefined4 uStack_2544;
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar136 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_2a50 = (undefined1 (*) [16])local_2390;
      auVar105 = vmaxss_avx(ZEXT816(0) << 0x40,
                            ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar116 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar6 = (ray->super_RayK<1>).dir.field_0;
      auVar115._8_4_ = 0x7fffffff;
      auVar115._0_8_ = 0x7fffffff7fffffff;
      auVar115._12_4_ = 0x7fffffff;
      auVar115 = vandps_avx((undefined1  [16])aVar6,auVar115);
      auVar128._8_4_ = 0x219392ef;
      auVar128._0_8_ = 0x219392ef219392ef;
      auVar128._12_4_ = 0x219392ef;
      auVar115 = vcmpps_avx(auVar115,auVar128,1);
      auVar146._8_4_ = 0x3f800000;
      auVar146._0_8_ = &DAT_3f8000003f800000;
      auVar146._12_4_ = 0x3f800000;
      auVar128 = vdivps_avx(auVar146,(undefined1  [16])aVar6);
      auVar147._8_4_ = 0x5d5e0b6b;
      auVar147._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar147._12_4_ = 0x5d5e0b6b;
      auVar115 = vblendvps_avx(auVar128,auVar147,auVar115);
      auVar126._0_4_ = auVar115._0_4_ * 0.99999964;
      auVar126._4_4_ = auVar115._4_4_ * 0.99999964;
      auVar126._8_4_ = auVar115._8_4_ * 0.99999964;
      auVar126._12_4_ = auVar115._12_4_ * 0.99999964;
      auVar114._0_4_ = auVar115._0_4_ * 1.0000004;
      auVar114._4_4_ = auVar115._4_4_ * 1.0000004;
      auVar114._8_4_ = auVar115._8_4_ * 1.0000004;
      auVar114._12_4_ = auVar115._12_4_ * 1.0000004;
      uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_2420._4_4_ = uVar3;
      local_2420._0_4_ = uVar3;
      local_2420._8_4_ = uVar3;
      local_2420._12_4_ = uVar3;
      local_2420._16_4_ = uVar3;
      local_2420._20_4_ = uVar3;
      local_2420._24_4_ = uVar3;
      local_2420._28_4_ = uVar3;
      auVar188 = ZEXT3264(local_2420);
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_2440._4_4_ = uVar3;
      local_2440._0_4_ = uVar3;
      local_2440._8_4_ = uVar3;
      local_2440._12_4_ = uVar3;
      local_2440._16_4_ = uVar3;
      local_2440._20_4_ = uVar3;
      local_2440._24_4_ = uVar3;
      local_2440._28_4_ = uVar3;
      auVar192 = ZEXT3264(local_2440);
      uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2460._4_4_ = uVar3;
      local_2460._0_4_ = uVar3;
      local_2460._8_4_ = uVar3;
      local_2460._12_4_ = uVar3;
      local_2460._16_4_ = uVar3;
      local_2460._20_4_ = uVar3;
      local_2460._24_4_ = uVar3;
      local_2460._28_4_ = uVar3;
      auVar209 = ZEXT3264(local_2460);
      auVar115 = vshufps_avx(auVar126,auVar126,0);
      local_2480._16_16_ = auVar115;
      local_2480._0_16_ = auVar115;
      auVar218 = ZEXT3264(local_2480);
      auVar115 = vmovshdup_avx(auVar126);
      auVar155 = ZEXT1664(auVar115);
      auVar128 = vshufps_avx(auVar126,auVar126,0x55);
      local_24a0._16_16_ = auVar128;
      local_24a0._0_16_ = auVar128;
      auVar221 = ZEXT3264(local_24a0);
      auVar128 = vshufpd_avx(auVar126,auVar126,1);
      auVar169 = ZEXT1664(auVar128);
      auVar146 = vshufps_avx(auVar126,auVar126,0xaa);
      local_24c0._16_16_ = auVar146;
      local_24c0._0_16_ = auVar146;
      auVar231 = ZEXT3264(local_24c0);
      auVar146 = vshufps_avx(auVar114,auVar114,0);
      local_24e0._16_16_ = auVar146;
      local_24e0._0_16_ = auVar146;
      auVar245 = ZEXT3264(local_24e0);
      auVar146 = vshufps_avx(auVar114,auVar114,0x55);
      local_2500._16_16_ = auVar146;
      local_2500._0_16_ = auVar146;
      auVar253 = ZEXT3264(local_2500);
      auVar146 = vshufps_avx(auVar114,auVar114,0xaa);
      local_2520._16_16_ = auVar146;
      local_2520._0_16_ = auVar146;
      auVar255 = ZEXT3264(local_2520);
      uVar74 = (ulong)(auVar126._0_4_ < 0.0) << 5;
      uVar92 = (ulong)(auVar115._0_4_ < 0.0) << 5 | 0x40;
      uVar94 = (ulong)(auVar128._0_4_ < 0.0) << 5 | 0x80;
      auVar115 = vshufps_avx(auVar105,auVar105,0);
      local_28e0._16_16_ = auVar115;
      local_28e0._0_16_ = auVar115;
      auVar184 = ZEXT3264(local_28e0);
      auVar115 = vshufps_avx(auVar116,auVar116,0);
      local_23e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_23e0._0_16_ = mm_lookupmask_ps._0_16_;
      auVar100 = ZEXT3264(CONCAT1616(auVar115,auVar115));
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = &DAT_3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar129._16_4_ = 0x3f800000;
      auVar129._20_4_ = 0x3f800000;
      auVar129._24_4_ = 0x3f800000;
      auVar129._28_4_ = 0x3f800000;
      auVar136 = ZEXT3264(auVar129);
      auVar107._8_4_ = 0xbf800000;
      auVar107._0_8_ = 0xbf800000bf800000;
      auVar107._12_4_ = 0xbf800000;
      auVar107._16_4_ = 0xbf800000;
      auVar107._20_4_ = 0xbf800000;
      auVar107._24_4_ = 0xbf800000;
      auVar107._28_4_ = 0xbf800000;
      local_2400 = vblendvps_avx(auVar129,auVar107,local_23e0);
      local_29b8 = uVar74;
      local_29c0 = uVar92;
      local_29c8 = uVar94;
      uVar75 = uVar74;
      uVar78 = uVar92;
      uVar79 = uVar94;
      do {
        do {
          fVar4 = (ray->super_RayK<1>).tfar;
          auVar111 = ZEXT464((uint)fVar4);
          do {
            if (local_2a50 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar62 = local_2a50 + -1;
            local_2a50 = local_2a50 + -1;
          } while (fVar4 < *(float *)(*pauVar62 + 8));
          uVar91 = *(ulong *)*local_2a50;
          do {
            if ((uVar91 & 8) == 0) {
              uVar71 = uVar91 & 0xfffffffffffffff0;
              fVar4 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar118._4_4_ = fVar4;
              auVar118._0_4_ = fVar4;
              auVar118._8_4_ = fVar4;
              auVar118._12_4_ = fVar4;
              auVar118._16_4_ = fVar4;
              auVar118._20_4_ = fVar4;
              auVar118._24_4_ = fVar4;
              auVar118._28_4_ = fVar4;
              pfVar2 = (float *)(uVar71 + 0x100 + uVar75);
              pfVar1 = (float *)(uVar71 + 0x40 + uVar75);
              auVar108._0_4_ = fVar4 * *pfVar2 + *pfVar1;
              auVar108._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
              auVar108._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
              auVar108._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
              auVar108._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
              auVar108._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
              auVar108._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
              auVar108._28_4_ = auVar111._28_4_ + pfVar1[7];
              auVar107 = vsubps_avx(auVar108,auVar188._0_32_);
              auVar16._4_4_ = auVar218._4_4_ * auVar107._4_4_;
              auVar16._0_4_ = auVar218._0_4_ * auVar107._0_4_;
              auVar16._8_4_ = auVar218._8_4_ * auVar107._8_4_;
              auVar16._12_4_ = auVar218._12_4_ * auVar107._12_4_;
              auVar16._16_4_ = auVar218._16_4_ * auVar107._16_4_;
              auVar16._20_4_ = auVar218._20_4_ * auVar107._20_4_;
              auVar16._24_4_ = auVar218._24_4_ * auVar107._24_4_;
              auVar16._28_4_ = auVar107._28_4_;
              pfVar2 = (float *)(uVar71 + 0x100 + uVar78);
              pfVar1 = (float *)(uVar71 + 0x40 + uVar78);
              auVar130._0_4_ = fVar4 * *pfVar2 + *pfVar1;
              auVar130._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
              auVar130._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
              auVar130._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
              auVar130._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
              auVar130._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
              auVar130._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
              auVar130._28_4_ = auVar136._28_4_ + pfVar1[7];
              auVar107 = vmaxps_avx(auVar184._0_32_,auVar16);
              auVar129 = vsubps_avx(auVar130,auVar192._0_32_);
              pfVar2 = (float *)(uVar71 + 0x100 + uVar79);
              auVar17._4_4_ = auVar221._4_4_ * auVar129._4_4_;
              auVar17._0_4_ = auVar221._0_4_ * auVar129._0_4_;
              auVar17._8_4_ = auVar221._8_4_ * auVar129._8_4_;
              auVar17._12_4_ = auVar221._12_4_ * auVar129._12_4_;
              auVar17._16_4_ = auVar221._16_4_ * auVar129._16_4_;
              auVar17._20_4_ = auVar221._20_4_ * auVar129._20_4_;
              auVar17._24_4_ = auVar221._24_4_ * auVar129._24_4_;
              auVar17._28_4_ = auVar129._28_4_;
              pfVar1 = (float *)(uVar71 + 0x40 + uVar79);
              auVar150._0_4_ = fVar4 * *pfVar2 + *pfVar1;
              auVar150._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
              auVar150._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
              auVar150._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
              auVar150._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
              auVar150._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
              auVar150._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
              auVar150._28_4_ = auVar155._28_4_ + pfVar1[7];
              auVar129 = vsubps_avx(auVar150,auVar209._0_32_);
              auVar18._4_4_ = auVar231._4_4_ * auVar129._4_4_;
              auVar18._0_4_ = auVar231._0_4_ * auVar129._0_4_;
              auVar18._8_4_ = auVar231._8_4_ * auVar129._8_4_;
              auVar18._12_4_ = auVar231._12_4_ * auVar129._12_4_;
              auVar18._16_4_ = auVar231._16_4_ * auVar129._16_4_;
              auVar18._20_4_ = auVar231._20_4_ * auVar129._20_4_;
              fVar13 = auVar129._28_4_;
              auVar18._24_4_ = auVar231._24_4_ * auVar129._24_4_;
              auVar18._28_4_ = fVar13;
              auVar129 = vmaxps_avx(auVar17,auVar18);
              pfVar2 = (float *)(uVar71 + 0x100 + (uVar74 ^ 0x20));
              local_26e0 = vmaxps_avx(auVar107,auVar129);
              auVar111 = ZEXT3264(local_26e0);
              pfVar1 = (float *)(uVar71 + 0x40 + (uVar74 ^ 0x20));
              auVar131._0_4_ = fVar4 * *pfVar2 + *pfVar1;
              auVar131._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
              auVar131._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
              auVar131._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
              auVar131._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
              auVar131._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
              auVar131._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
              auVar131._28_4_ = fVar13 + pfVar1[7];
              auVar107 = vsubps_avx(auVar131,auVar188._0_32_);
              pfVar2 = (float *)(uVar71 + 0x100 + (uVar92 ^ 0x20));
              pfVar1 = (float *)(uVar71 + 0x40 + (uVar92 ^ 0x20));
              auVar151._0_4_ = fVar4 * *pfVar2 + *pfVar1;
              auVar151._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
              auVar151._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
              auVar151._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
              auVar151._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
              auVar151._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
              auVar151._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
              auVar151._28_4_ = fVar13 + pfVar1[7];
              auVar19._4_4_ = auVar245._4_4_ * auVar107._4_4_;
              auVar19._0_4_ = auVar245._0_4_ * auVar107._0_4_;
              auVar19._8_4_ = auVar245._8_4_ * auVar107._8_4_;
              auVar19._12_4_ = auVar245._12_4_ * auVar107._12_4_;
              auVar19._16_4_ = auVar245._16_4_ * auVar107._16_4_;
              auVar19._20_4_ = auVar245._20_4_ * auVar107._20_4_;
              auVar19._24_4_ = auVar245._24_4_ * auVar107._24_4_;
              auVar19._28_4_ = auVar107._28_4_;
              auVar107 = vsubps_avx(auVar151,auVar192._0_32_);
              pfVar2 = (float *)(uVar71 + 0x100 + (uVar94 ^ 0x20));
              auVar20._4_4_ = auVar253._4_4_ * auVar107._4_4_;
              auVar20._0_4_ = auVar253._0_4_ * auVar107._0_4_;
              auVar20._8_4_ = auVar253._8_4_ * auVar107._8_4_;
              auVar20._12_4_ = auVar253._12_4_ * auVar107._12_4_;
              auVar20._16_4_ = auVar253._16_4_ * auVar107._16_4_;
              auVar20._20_4_ = auVar253._20_4_ * auVar107._20_4_;
              auVar20._24_4_ = auVar253._24_4_ * auVar107._24_4_;
              auVar20._28_4_ = auVar107._28_4_;
              pfVar1 = (float *)(uVar71 + 0x40 + (uVar94 ^ 0x20));
              auVar166._0_4_ = fVar4 * *pfVar2 + *pfVar1;
              auVar166._4_4_ = fVar4 * pfVar2[1] + pfVar1[1];
              auVar166._8_4_ = fVar4 * pfVar2[2] + pfVar1[2];
              auVar166._12_4_ = fVar4 * pfVar2[3] + pfVar1[3];
              auVar166._16_4_ = fVar4 * pfVar2[4] + pfVar1[4];
              auVar166._20_4_ = fVar4 * pfVar2[5] + pfVar1[5];
              auVar166._24_4_ = fVar4 * pfVar2[6] + pfVar1[6];
              auVar166._28_4_ = auVar169._28_4_ + pfVar1[7];
              auVar107 = vsubps_avx(auVar166,auVar209._0_32_);
              auVar21._4_4_ = auVar255._4_4_ * auVar107._4_4_;
              auVar21._0_4_ = auVar255._0_4_ * auVar107._0_4_;
              auVar21._8_4_ = auVar255._8_4_ * auVar107._8_4_;
              auVar21._12_4_ = auVar255._12_4_ * auVar107._12_4_;
              auVar21._16_4_ = auVar255._16_4_ * auVar107._16_4_;
              auVar21._20_4_ = auVar255._20_4_ * auVar107._20_4_;
              auVar21._24_4_ = auVar255._24_4_ * auVar107._24_4_;
              auVar21._28_4_ = auVar107._28_4_;
              auVar169 = ZEXT3264(auVar21);
              auVar129 = vminps_avx(auVar20,auVar21);
              auVar107 = vminps_avx(auVar100._0_32_,auVar19);
              auVar107 = vminps_avx(auVar107,auVar129);
              auVar107 = vcmpps_avx(local_26e0,auVar107,2);
              auVar136 = ZEXT3264(auVar107);
              if (((uint)uVar91 & 7) == 6) {
                auVar129 = vcmpps_avx(*(undefined1 (*) [32])(uVar71 + 0x1c0),auVar118,2);
                auVar16 = vcmpps_avx(auVar118,*(undefined1 (*) [32])(uVar71 + 0x1e0),1);
                auVar16 = vandps_avx(auVar129,auVar16);
                auVar107 = vandps_avx(auVar16,auVar107);
                auVar136 = ZEXT1664(auVar107._16_16_);
                auVar115 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
              }
              else {
                auVar115 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
              }
              auVar155 = ZEXT3264(auVar129);
              auVar115 = vpsllw_avx(auVar115,0xf);
              auVar115 = vpacksswb_avx(auVar115,auVar115);
              local_2988 = (ulong)(byte)(SUB161(auVar115 >> 7,0) & 1 |
                                         (SUB161(auVar115 >> 0xf,0) & 1) << 1 |
                                         (SUB161(auVar115 >> 0x17,0) & 1) << 2 |
                                         (SUB161(auVar115 >> 0x1f,0) & 1) << 3 |
                                         (SUB161(auVar115 >> 0x27,0) & 1) << 4 |
                                         (SUB161(auVar115 >> 0x2f,0) & 1) << 5 |
                                         (SUB161(auVar115 >> 0x37,0) & 1) << 6 |
                                        SUB161(auVar115 >> 0x3f,0) << 7);
            }
            if ((uVar91 & 8) == 0) {
              if (local_2988 == 0) {
                iVar76 = 4;
              }
              else {
                uVar71 = uVar91 & 0xfffffffffffffff0;
                lVar73 = 0;
                if (local_2988 != 0) {
                  for (; (local_2988 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                  }
                }
                iVar76 = 0;
                uVar91 = *(ulong *)(uVar71 + lVar73 * 8);
                uVar84 = local_2988 - 1 & local_2988;
                if (uVar84 != 0) {
                  uVar70 = *(uint *)(local_26e0 + lVar73 * 4);
                  lVar73 = 0;
                  if (uVar84 != 0) {
                    for (; (uVar84 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                    }
                  }
                  uVar80 = *(ulong *)(uVar71 + lVar73 * 8);
                  uVar69 = *(uint *)(local_26e0 + lVar73 * 4);
                  uVar84 = uVar84 - 1 & uVar84;
                  if (uVar84 == 0) {
                    if (uVar70 < uVar69) {
                      *(ulong *)*local_2a50 = uVar80;
                      *(uint *)(*local_2a50 + 8) = uVar69;
                      local_2a50 = local_2a50 + 1;
                    }
                    else {
                      *(ulong *)*local_2a50 = uVar91;
                      *(uint *)(*local_2a50 + 8) = uVar70;
                      uVar91 = uVar80;
                      local_2a50 = local_2a50 + 1;
                    }
                  }
                  else {
                    auVar105._8_8_ = 0;
                    auVar105._0_8_ = uVar91;
                    auVar115 = vpunpcklqdq_avx(auVar105,ZEXT416(uVar70));
                    auVar116._8_8_ = 0;
                    auVar116._0_8_ = uVar80;
                    auVar128 = vpunpcklqdq_avx(auVar116,ZEXT416(uVar69));
                    lVar73 = 0;
                    if (uVar84 != 0) {
                      for (; (uVar84 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                      }
                    }
                    auVar127._8_8_ = 0;
                    auVar127._0_8_ = *(ulong *)(uVar71 + lVar73 * 8);
                    auVar105 = vpunpcklqdq_avx(auVar127,ZEXT416(*(uint *)(local_26e0 + lVar73 * 4)))
                    ;
                    uVar84 = uVar84 - 1 & uVar84;
                    if (uVar84 == 0) {
                      auVar116 = vpcmpgtd_avx(auVar128,auVar115);
                      auVar146 = vpshufd_avx(auVar116,0xaa);
                      auVar116 = vblendvps_avx(auVar128,auVar115,auVar146);
                      auVar115 = vblendvps_avx(auVar115,auVar128,auVar146);
                      auVar128 = vpcmpgtd_avx(auVar105,auVar116);
                      auVar146 = vpshufd_avx(auVar128,0xaa);
                      auVar128 = vblendvps_avx(auVar105,auVar116,auVar146);
                      auVar155 = ZEXT1664(auVar128);
                      auVar105 = vblendvps_avx(auVar116,auVar105,auVar146);
                      auVar116 = vpcmpgtd_avx(auVar105,auVar115);
                      auVar146 = vpshufd_avx(auVar116,0xaa);
                      auVar136 = ZEXT1664(auVar146);
                      auVar116 = vblendvps_avx(auVar105,auVar115,auVar146);
                      auVar169 = ZEXT1664(auVar116);
                      auVar115 = vblendvps_avx(auVar115,auVar105,auVar146);
                      auVar111 = ZEXT1664(auVar115);
                      *local_2a50 = auVar115;
                      local_2a50[1] = auVar116;
                      uVar91 = auVar128._0_8_;
                      local_2a50 = local_2a50 + 2;
                    }
                    else {
                      lVar73 = 0;
                      if (uVar84 != 0) {
                        for (; (uVar84 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                        }
                      }
                      auVar169 = ZEXT464(*(uint *)(local_26e0 + lVar73 * 4));
                      auVar148._8_8_ = 0;
                      auVar148._0_8_ = *(ulong *)(uVar71 + lVar73 * 8);
                      auVar116 = vpunpcklqdq_avx(auVar148,ZEXT416(*(uint *)(local_26e0 + lVar73 * 4)
                                                                 ));
                      uVar84 = uVar84 - 1 & uVar84;
                      if (uVar84 == 0) {
                        auVar146 = vpcmpgtd_avx(auVar128,auVar115);
                        auVar114 = vpshufd_avx(auVar146,0xaa);
                        auVar146 = vblendvps_avx(auVar128,auVar115,auVar114);
                        auVar115 = vblendvps_avx(auVar115,auVar128,auVar114);
                        auVar128 = vpcmpgtd_avx(auVar116,auVar105);
                        auVar114 = vpshufd_avx(auVar128,0xaa);
                        auVar128 = vblendvps_avx(auVar116,auVar105,auVar114);
                        auVar105 = vblendvps_avx(auVar105,auVar116,auVar114);
                        auVar116 = vpcmpgtd_avx(auVar105,auVar115);
                        auVar114 = vpshufd_avx(auVar116,0xaa);
                        auVar116 = vblendvps_avx(auVar105,auVar115,auVar114);
                        auVar115 = vblendvps_avx(auVar115,auVar105,auVar114);
                        auVar105 = vpcmpgtd_avx(auVar128,auVar146);
                        auVar114 = vpshufd_avx(auVar105,0xaa);
                        auVar105 = vblendvps_avx(auVar128,auVar146,auVar114);
                        auVar128 = vblendvps_avx(auVar146,auVar128,auVar114);
                        auVar146 = vpcmpgtd_avx(auVar116,auVar128);
                        auVar114 = vpshufd_avx(auVar146,0xaa);
                        auVar169 = ZEXT1664(auVar114);
                        auVar146 = vblendvps_avx(auVar116,auVar128,auVar114);
                        auVar128 = vblendvps_avx(auVar128,auVar116,auVar114);
                        *local_2a50 = auVar115;
                        local_2a50[1] = auVar128;
                        local_2a50[2] = auVar146;
                        uVar91 = auVar105._0_8_;
                        local_2a50 = local_2a50 + 3;
                      }
                      else {
                        *local_2a50 = auVar115;
                        local_2a50[1] = auVar128;
                        local_2a50[2] = auVar105;
                        local_2a50[3] = auVar116;
                        lVar73 = 0x30;
                        do {
                          lVar72 = lVar73;
                          lVar73 = 0;
                          if (uVar84 != 0) {
                            for (; (uVar84 >> lVar73 & 1) == 0; lVar73 = lVar73 + 1) {
                            }
                          }
                          auVar106._8_8_ = 0;
                          auVar106._0_8_ = *(ulong *)(uVar71 + lVar73 * 8);
                          auVar115 = vpunpcklqdq_avx(auVar106,ZEXT416(*(uint *)(local_26e0 +
                                                                               lVar73 * 4)));
                          *(undefined1 (*) [16])(local_2a50[1] + lVar72) = auVar115;
                          uVar84 = uVar84 & uVar84 - 1;
                          lVar73 = lVar72 + 0x10;
                        } while (uVar84 != 0);
                        pauVar62 = (undefined1 (*) [16])(local_2a50[1] + lVar72);
                        if (lVar72 + 0x10 != 0) {
                          lVar73 = 0x10;
                          pauVar77 = local_2a50;
                          do {
                            auVar115 = pauVar77[1];
                            uVar70 = *(uint *)(pauVar77[1] + 8);
                            pauVar77 = pauVar77 + 1;
                            lVar72 = lVar73;
                            do {
                              if (uVar70 <= *(uint *)(local_2a50[-1] + lVar72 + 8)) {
                                pauVar82 = (undefined1 (*) [16])(*local_2a50 + lVar72);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_2a50 + lVar72) =
                                   *(undefined1 (*) [16])(local_2a50[-1] + lVar72);
                              lVar72 = lVar72 + -0x10;
                              pauVar82 = local_2a50;
                            } while (lVar72 != 0);
                            *pauVar82 = auVar115;
                            lVar73 = lVar73 + 0x10;
                          } while (pauVar62 != pauVar77);
                        }
                        uVar91 = *(ulong *)*pauVar62;
                        local_2a50 = pauVar62;
                      }
                      auVar111 = ZEXT1664(auVar115);
                      auVar155 = ZEXT1664(auVar116);
                      auVar136 = ZEXT1664(auVar105);
                      auVar184 = ZEXT3264(local_28e0);
                    }
                  }
                }
              }
            }
            else {
              iVar76 = 6;
            }
          } while (iVar76 == 0);
        } while (iVar76 != 6);
        local_29b0 = (ulong)((uint)uVar91 & 0xf) - 8;
        if (local_29b0 != 0) {
          uVar91 = uVar91 & 0xfffffffffffffff0;
          local_2a00 = context->scene;
          local_2990 = 0;
          do {
            lVar72 = local_2990 * 0x60;
            pRVar7 = (local_2a00->geometries).items;
            pGVar8 = pRVar7[*(uint *)(uVar91 + 0x40 + lVar72)].ptr;
            fVar4 = (pGVar8->time_range).lower;
            fVar4 = pGVar8->fnumTimeSegments *
                    (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar4) /
                    ((pGVar8->time_range).upper - fVar4));
            auVar115 = vroundss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),9);
            auVar115 = vminss_avx(auVar115,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
            auVar117 = vmaxss_avx(ZEXT816(0) << 0x20,auVar115);
            iVar76 = (int)auVar117._0_4_;
            lVar85 = (long)iVar76 * 0x38;
            lVar73 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar85);
            uVar83 = (ulong)*(uint *)(uVar91 + 4 + lVar72);
            auVar115 = *(undefined1 (*) [16])(lVar73 + (ulong)*(uint *)(uVar91 + lVar72) * 4);
            uVar75 = (ulong)*(uint *)(uVar91 + 0x10 + lVar72);
            auVar128 = *(undefined1 (*) [16])(lVar73 + uVar75 * 4);
            uVar78 = (ulong)*(uint *)(uVar91 + 0x20 + lVar72);
            auVar105 = *(undefined1 (*) [16])(lVar73 + uVar78 * 4);
            uVar79 = (ulong)*(uint *)(uVar91 + 0x30 + lVar72);
            auVar116 = *(undefined1 (*) [16])(lVar73 + uVar79 * 4);
            local_29a0 = *(long *)&pRVar7[*(uint *)(uVar91 + 0x44 + lVar72)].ptr[2].numPrimitives;
            lVar73 = *(long *)(local_29a0 + lVar85);
            auVar146 = *(undefined1 (*) [16])(lVar73 + uVar83 * 4);
            uVar71 = (ulong)*(uint *)(uVar91 + 0x14 + lVar72);
            auVar114 = *(undefined1 (*) [16])(lVar73 + uVar71 * 4);
            uVar84 = (ulong)*(uint *)(uVar91 + 0x24 + lVar72);
            auVar126 = *(undefined1 (*) [16])(lVar73 + uVar84 * 4);
            uVar80 = (ulong)*(uint *)(uVar91 + 0x34 + lVar72);
            auVar147 = *(undefined1 (*) [16])(lVar73 + uVar80 * 4);
            lVar73 = *(long *)&pRVar7[*(uint *)(uVar91 + 0x48 + lVar72)].ptr[2].numPrimitives;
            lVar9 = *(long *)(lVar73 + lVar85);
            uVar81 = (ulong)*(uint *)(uVar91 + 8 + lVar72);
            auVar127 = *(undefined1 (*) [16])(lVar9 + uVar81 * 4);
            local_29a8 = (ulong)*(uint *)(uVar91 + 0x18 + lVar72);
            auVar148 = *(undefined1 (*) [16])(lVar9 + local_29a8 * 4);
            local_2998 = (ulong)*(uint *)(uVar91 + 0x28 + lVar72);
            auVar106 = *(undefined1 (*) [16])(lVar9 + local_2998 * 4);
            uVar87 = (ulong)*(uint *)(uVar91 + 0x38 + lVar72);
            auVar96 = *(undefined1 (*) [16])(lVar9 + uVar87 * 4);
            fVar4 = fVar4 - auVar117._0_4_;
            lVar9 = *(long *)&pRVar7[*(uint *)(uVar91 + 0x4c + lVar72)].ptr[2].numPrimitives;
            lVar85 = *(long *)(lVar9 + lVar85);
            uVar86 = (ulong)*(uint *)(uVar91 + 0xc + lVar72);
            auVar117 = *(undefined1 (*) [16])(lVar85 + uVar86 * 4);
            uVar89 = (ulong)*(uint *)(uVar91 + 0x1c + lVar72);
            auVar149 = *(undefined1 (*) [16])(lVar85 + uVar89 * 4);
            auVar165 = vunpcklps_avx(auVar115,auVar127);
            auVar127 = vunpckhps_avx(auVar115,auVar127);
            auVar252 = vunpcklps_avx(auVar146,auVar117);
            auVar146 = vunpckhps_avx(auVar146,auVar117);
            uVar88 = (ulong)*(uint *)(uVar91 + 0x2c + lVar72);
            auVar115 = *(undefined1 (*) [16])(lVar85 + uVar88 * 4);
            auVar117 = vunpcklps_avx(auVar127,auVar146);
            _local_2710 = vunpcklps_avx(auVar165,auVar252);
            auVar68 = _local_2710;
            auVar146 = vunpckhps_avx(auVar165,auVar252);
            auVar165 = vunpcklps_avx(auVar128,auVar148);
            auVar127 = vunpckhps_avx(auVar128,auVar148);
            auVar148 = vunpcklps_avx(auVar114,auVar149);
            auVar114 = vunpckhps_avx(auVar114,auVar149);
            uVar90 = (ulong)*(uint *)(uVar91 + 0x3c + lVar72);
            auVar128 = *(undefined1 (*) [16])(lVar85 + uVar90 * 4);
            auVar127 = vunpcklps_avx(auVar127,auVar114);
            auVar149 = vunpcklps_avx(auVar165,auVar148);
            _local_28c0 = auVar149;
            auVar118 = _local_28c0;
            auVar114 = vunpckhps_avx(auVar165,auVar148);
            auVar148 = vunpcklps_avx(auVar105,auVar106);
            auVar105 = vunpckhps_avx(auVar105,auVar106);
            auVar106 = vunpcklps_avx(auVar126,auVar115);
            auVar126 = vunpckhps_avx(auVar126,auVar115);
            lVar93 = (long)(iVar76 + 1) * 0x38;
            lVar85 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar93);
            auVar115 = *(undefined1 (*) [16])(lVar85 + (ulong)*(uint *)(uVar91 + lVar72) * 4);
            _local_2720 = vunpcklps_avx(auVar105,auVar126);
            auVar67 = _local_2720;
            _local_2760 = vunpcklps_avx(auVar148,auVar106);
            auVar63 = _local_2760;
            _local_2750 = vunpckhps_avx(auVar148,auVar106);
            auVar64 = _local_2750;
            auVar126 = vunpcklps_avx(auVar116,auVar96);
            auVar105 = vunpckhps_avx(auVar116,auVar96);
            auVar148 = vunpcklps_avx(auVar147,auVar128);
            auVar116 = vunpckhps_avx(auVar147,auVar128);
            lVar73 = *(long *)(lVar73 + lVar93);
            auVar128 = *(undefined1 (*) [16])(lVar73 + uVar81 * 4);
            _local_2730 = vunpcklps_avx(auVar105,auVar116);
            auVar66 = _local_2730;
            auVar106 = vunpcklps_avx(auVar126,auVar148);
            _local_2740 = vunpckhps_avx(auVar126,auVar148);
            auVar65 = _local_2740;
            lVar10 = *(long *)(local_29a0 + lVar93);
            auVar116 = vunpcklps_avx(auVar115,auVar128);
            auVar105 = vunpckhps_avx(auVar115,auVar128);
            auVar115 = *(undefined1 (*) [16])(lVar10 + uVar83 * 4);
            lVar9 = *(long *)(lVar9 + lVar93);
            auVar128 = *(undefined1 (*) [16])(lVar9 + uVar86 * 4);
            auVar126 = vunpcklps_avx(auVar115,auVar128);
            auVar115 = vunpckhps_avx(auVar115,auVar128);
            auVar148 = vunpcklps_avx(auVar105,auVar115);
            auVar96 = vunpcklps_avx(auVar116,auVar126);
            auVar105 = vunpckhps_avx(auVar116,auVar126);
            auVar115 = *(undefined1 (*) [16])(lVar85 + uVar75 * 4);
            auVar128 = *(undefined1 (*) [16])(lVar73 + local_29a8 * 4);
            auVar126 = vunpcklps_avx(auVar115,auVar128);
            auVar116 = vunpckhps_avx(auVar115,auVar128);
            auVar115 = *(undefined1 (*) [16])(lVar10 + uVar71 * 4);
            auVar128 = *(undefined1 (*) [16])(lVar9 + uVar89 * 4);
            auVar147 = vunpcklps_avx(auVar115,auVar128);
            auVar115 = vunpckhps_avx(auVar115,auVar128);
            auVar165 = vunpcklps_avx(auVar116,auVar115);
            auVar252 = vunpcklps_avx(auVar126,auVar147);
            auVar116 = vunpckhps_avx(auVar126,auVar147);
            auVar115 = *(undefined1 (*) [16])(lVar85 + uVar78 * 4);
            auVar128 = *(undefined1 (*) [16])(lVar73 + local_2998 * 4);
            auVar147 = vunpcklps_avx(auVar115,auVar128);
            auVar126 = vunpckhps_avx(auVar115,auVar128);
            auVar115 = *(undefined1 (*) [16])(lVar10 + uVar84 * 4);
            auVar128 = *(undefined1 (*) [16])(lVar9 + uVar88 * 4);
            auVar185 = vunpcklps_avx(auVar115,auVar128);
            auVar115 = vunpckhps_avx(auVar115,auVar128);
            auVar22 = vunpcklps_avx(auVar126,auVar115);
            auVar23 = vunpcklps_avx(auVar147,auVar185);
            auVar126 = vunpckhps_avx(auVar147,auVar185);
            auVar115 = *(undefined1 (*) [16])(lVar85 + uVar79 * 4);
            auVar128 = *(undefined1 (*) [16])(lVar73 + uVar87 * 4);
            auVar185 = vunpcklps_avx(auVar115,auVar128);
            auVar147 = vunpckhps_avx(auVar115,auVar128);
            auVar115 = *(undefined1 (*) [16])(lVar10 + uVar80 * 4);
            auVar128 = *(undefined1 (*) [16])(lVar9 + uVar90 * 4);
            auVar24 = vunpcklps_avx(auVar115,auVar128);
            auVar115 = vunpckhps_avx(auVar115,auVar128);
            auVar25 = vunpcklps_avx(auVar147,auVar115);
            auVar26 = vunpcklps_avx(auVar185,auVar24);
            auVar147 = vunpckhps_avx(auVar185,auVar24);
            auVar115 = vshufps_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4),0);
            auVar128 = vshufps_avx(ZEXT416((uint)(1.0 - fVar4)),ZEXT416((uint)(1.0 - fVar4)),0);
            fVar4 = auVar115._0_4_;
            fVar13 = auVar115._4_4_;
            fVar14 = auVar115._8_4_;
            fVar15 = auVar115._12_4_;
            fVar103 = auVar128._0_4_;
            fVar112 = auVar128._4_4_;
            fVar113 = auVar128._8_4_;
            fVar104 = auVar128._12_4_;
            auVar109._4_4_ = fVar112 * (float)local_2710._4_4_ + auVar96._4_4_ * fVar13;
            auVar109._0_4_ = fVar103 * (float)local_2710._0_4_ + auVar96._0_4_ * fVar4;
            auVar109._8_4_ = fVar113 * fStack_2708 + auVar96._8_4_ * fVar14;
            auVar109._12_4_ = fVar104 * fStack_2704 + auVar96._12_4_ * fVar15;
            local_28a0._0_4_ = auVar146._0_4_;
            local_28a0._4_4_ = auVar146._4_4_;
            fStack_2898 = auVar146._8_4_;
            fStack_2894 = auVar146._12_4_;
            auVar132._4_4_ = fVar112 * (float)local_28a0._4_4_ + fVar13 * auVar105._4_4_;
            auVar132._0_4_ = fVar103 * (float)local_28a0._0_4_ + fVar4 * auVar105._0_4_;
            auVar132._8_4_ = fVar113 * fStack_2898 + fVar14 * auVar105._8_4_;
            auVar132._12_4_ = fVar104 * fStack_2894 + fVar15 * auVar105._12_4_;
            local_2840._0_4_ = auVar117._0_4_;
            local_2840._4_4_ = auVar117._4_4_;
            fStack_2838 = auVar117._8_4_;
            fStack_2834 = auVar117._12_4_;
            auVar182._4_4_ = fVar112 * (float)local_2840._4_4_ + auVar148._4_4_ * fVar13;
            auVar182._0_4_ = fVar103 * (float)local_2840._0_4_ + auVar148._0_4_ * fVar4;
            auVar182._8_4_ = fVar113 * fStack_2838 + auVar148._8_4_ * fVar14;
            auVar182._12_4_ = fVar104 * fStack_2834 + auVar148._12_4_ * fVar15;
            local_28c0._0_4_ = auVar149._0_4_;
            local_28c0._4_4_ = auVar149._4_4_;
            fStack_28b8 = auVar149._8_4_;
            fStack_28b4 = auVar149._12_4_;
            auVar185._0_4_ = fVar103 * (float)local_28c0._0_4_ + fVar4 * auVar252._0_4_;
            auVar185._4_4_ = fVar112 * (float)local_28c0._4_4_ + fVar13 * auVar252._4_4_;
            auVar185._8_4_ = fVar113 * fStack_28b8 + fVar14 * auVar252._8_4_;
            auVar185._12_4_ = fVar104 * fStack_28b4 + fVar15 * auVar252._12_4_;
            local_2880._0_4_ = auVar114._0_4_;
            local_2880._4_4_ = auVar114._4_4_;
            fStack_2878 = auVar114._8_4_;
            fStack_2874 = auVar114._12_4_;
            auVar117._0_4_ = fVar103 * (float)local_2880._0_4_ + auVar116._0_4_ * fVar4;
            auVar117._4_4_ = fVar112 * (float)local_2880._4_4_ + auVar116._4_4_ * fVar13;
            auVar117._8_4_ = fVar113 * fStack_2878 + auVar116._8_4_ * fVar14;
            auVar117._12_4_ = fVar104 * fStack_2874 + auVar116._12_4_ * fVar15;
            local_2820._0_4_ = auVar127._0_4_;
            local_2820._4_4_ = auVar127._4_4_;
            fStack_2818 = auVar127._8_4_;
            fStack_2814 = auVar127._12_4_;
            auVar252._0_4_ = fVar103 * (float)local_2820._0_4_ + auVar165._0_4_ * fVar4;
            auVar252._4_4_ = fVar112 * (float)local_2820._4_4_ + auVar165._4_4_ * fVar13;
            auVar252._8_4_ = fVar113 * fStack_2818 + auVar165._8_4_ * fVar14;
            auVar252._12_4_ = fVar104 * fStack_2814 + auVar165._12_4_ * fVar15;
            auVar109._20_4_ = fVar112 * (float)local_2760._4_4_ + fVar13 * auVar23._4_4_;
            auVar109._16_4_ = fVar103 * (float)local_2760._0_4_ + fVar4 * auVar23._0_4_;
            auVar109._24_4_ = fVar113 * fStack_2758 + fVar14 * auVar23._8_4_;
            auVar109._28_4_ = fVar104 * fStack_2754 + fVar15 * auVar23._12_4_;
            auVar132._20_4_ = fVar112 * (float)local_2750._4_4_ + auVar126._4_4_ * fVar13;
            auVar132._16_4_ = fVar103 * (float)local_2750._0_4_ + auVar126._0_4_ * fVar4;
            auVar132._24_4_ = fVar113 * fStack_2748 + auVar126._8_4_ * fVar14;
            auVar132._28_4_ = fVar104 * fStack_2744 + auVar126._12_4_ * fVar15;
            auVar182._20_4_ = fVar112 * (float)local_2720._4_4_ + auVar22._4_4_ * fVar13;
            auVar182._16_4_ = fVar103 * (float)local_2720._0_4_ + auVar22._0_4_ * fVar4;
            auVar182._24_4_ = fVar113 * fStack_2718 + auVar22._8_4_ * fVar14;
            auVar182._28_4_ = fVar104 * fStack_2714 + auVar22._12_4_ * fVar15;
            lVar73 = uVar91 + 0x40 + lVar72;
            local_23c0 = *(undefined8 *)(lVar73 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar73 + 0x18);
            auVar149._0_4_ = auVar106._0_4_ * fVar103 + fVar4 * auVar26._0_4_;
            auVar149._4_4_ = auVar106._4_4_ * fVar112 + fVar13 * auVar26._4_4_;
            auVar149._8_4_ = auVar106._8_4_ * fVar113 + fVar14 * auVar26._8_4_;
            auVar149._12_4_ = auVar106._12_4_ * fVar104 + fVar15 * auVar26._12_4_;
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar72 = uVar91 + 0x50 + lVar72;
            local_2700 = *(undefined8 *)(lVar72 + 0x10);
            uStack_26f8 = *(undefined8 *)(lVar72 + 0x18);
            auVar165._0_4_ = fVar103 * (float)local_2740._0_4_ + fVar4 * auVar147._0_4_;
            auVar165._4_4_ = fVar112 * (float)local_2740._4_4_ + fVar13 * auVar147._4_4_;
            auVar165._8_4_ = fVar113 * fStack_2738 + fVar14 * auVar147._8_4_;
            auVar165._12_4_ = fVar104 * fStack_2734 + fVar15 * auVar147._12_4_;
            auVar96._0_4_ = fVar103 * (float)local_2730._0_4_ + fVar4 * auVar25._0_4_;
            auVar96._4_4_ = fVar112 * (float)local_2730._4_4_ + fVar13 * auVar25._4_4_;
            auVar96._8_4_ = fVar113 * fStack_2728 + fVar14 * auVar25._8_4_;
            auVar96._12_4_ = fVar104 * fStack_2724 + fVar15 * auVar25._12_4_;
            uStack_26f0 = local_2700;
            uStack_26e8 = uStack_26f8;
            auVar186._16_16_ = auVar185;
            auVar186._0_16_ = auVar185;
            auVar119._16_16_ = auVar117;
            auVar119._0_16_ = auVar117;
            auVar191._16_16_ = auVar252;
            auVar191._0_16_ = auVar252;
            auVar152._16_16_ = auVar149;
            auVar152._0_16_ = auVar149;
            auVar167._16_16_ = auVar165;
            auVar167._0_16_ = auVar165;
            auVar206._16_16_ = auVar96;
            auVar206._0_16_ = auVar96;
            uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar217._4_4_ = uVar3;
            auVar217._0_4_ = uVar3;
            auVar217._8_4_ = uVar3;
            auVar217._12_4_ = uVar3;
            auVar217._16_4_ = uVar3;
            auVar217._20_4_ = uVar3;
            auVar217._24_4_ = uVar3;
            auVar217._28_4_ = uVar3;
            uVar5 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar220._4_4_ = uVar5;
            auVar220._0_4_ = uVar5;
            auVar220._8_4_ = uVar5;
            auVar220._12_4_ = uVar5;
            auVar220._16_4_ = uVar5;
            auVar220._20_4_ = uVar5;
            auVar220._24_4_ = uVar5;
            auVar220._28_4_ = uVar5;
            uVar5 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar230._4_4_ = uVar5;
            auVar230._0_4_ = uVar5;
            auVar230._8_4_ = uVar5;
            auVar230._12_4_ = uVar5;
            auVar230._16_4_ = uVar5;
            auVar230._20_4_ = uVar5;
            auVar230._24_4_ = uVar5;
            auVar230._28_4_ = uVar5;
            local_2780 = vsubps_avx(auVar109,auVar217);
            local_27a0 = vsubps_avx(auVar132,auVar220);
            local_27c0 = vsubps_avx(auVar182,auVar230);
            auVar107 = vsubps_avx(auVar186,auVar217);
            auVar129 = vsubps_avx(auVar119,auVar220);
            auVar16 = vsubps_avx(auVar191,auVar230);
            auVar17 = vsubps_avx(auVar152,auVar217);
            auVar18 = vsubps_avx(auVar167,auVar220);
            auVar19 = vsubps_avx(auVar206,auVar230);
            local_27e0 = vsubps_avx(auVar17,local_2780);
            local_2800 = vsubps_avx(auVar18,local_27a0);
            _local_2820 = vsubps_avx(auVar19,local_27c0);
            fVar4 = local_27a0._0_4_;
            fVar144 = auVar18._0_4_ + fVar4;
            fVar13 = local_27a0._4_4_;
            fVar156 = auVar18._4_4_ + fVar13;
            fVar14 = local_27a0._8_4_;
            fVar158 = auVar18._8_4_ + fVar14;
            fVar15 = local_27a0._12_4_;
            fVar159 = auVar18._12_4_ + fVar15;
            fVar103 = local_27a0._16_4_;
            fVar160 = auVar18._16_4_ + fVar103;
            fVar112 = local_27a0._20_4_;
            fVar161 = auVar18._20_4_ + fVar112;
            fVar113 = local_27a0._24_4_;
            fVar162 = auVar18._24_4_ + fVar113;
            fVar104 = local_27a0._28_4_;
            fVar254 = local_27c0._0_4_;
            fVar163 = fVar254 + auVar19._0_4_;
            fVar256 = local_27c0._4_4_;
            fVar170 = fVar256 + auVar19._4_4_;
            fVar257 = local_27c0._8_4_;
            fVar172 = fVar257 + auVar19._8_4_;
            fVar258 = local_27c0._12_4_;
            fVar174 = fVar258 + auVar19._12_4_;
            fVar259 = local_27c0._16_4_;
            fVar176 = fVar259 + auVar19._16_4_;
            fVar260 = local_27c0._20_4_;
            fVar178 = fVar260 + auVar19._20_4_;
            fVar261 = local_27c0._24_4_;
            fVar180 = fVar261 + auVar19._24_4_;
            fVar138 = auVar19._28_4_;
            fVar125 = local_27c0._28_4_;
            fVar95 = local_2820._0_4_;
            fVar101 = local_2820._4_4_;
            auVar27._4_4_ = fVar101 * fVar156;
            auVar27._0_4_ = fVar95 * fVar144;
            fVar102 = local_2820._8_4_;
            auVar27._8_4_ = fVar102 * fVar158;
            fVar121 = local_2820._12_4_;
            auVar27._12_4_ = fVar121 * fVar159;
            fVar122 = local_2820._16_4_;
            auVar27._16_4_ = fVar122 * fVar160;
            fVar123 = local_2820._20_4_;
            auVar27._20_4_ = fVar123 * fVar161;
            fVar124 = local_2820._24_4_;
            auVar27._24_4_ = fVar124 * fVar162;
            auVar27._28_4_ = auVar252._12_4_;
            fVar228 = local_2800._0_4_;
            fVar232 = local_2800._4_4_;
            auVar28._4_4_ = fVar232 * fVar170;
            auVar28._0_4_ = fVar228 * fVar163;
            fVar234 = local_2800._8_4_;
            auVar28._8_4_ = fVar234 * fVar172;
            fVar236 = local_2800._12_4_;
            auVar28._12_4_ = fVar236 * fVar174;
            fVar238 = local_2800._16_4_;
            auVar28._16_4_ = fVar238 * fVar176;
            fVar240 = local_2800._20_4_;
            auVar28._20_4_ = fVar240 * fVar178;
            fVar242 = local_2800._24_4_;
            auVar28._24_4_ = fVar242 * fVar180;
            auVar28._28_4_ = auVar96._12_4_;
            auVar20 = vsubps_avx(auVar28,auVar27);
            fVar244 = local_2780._0_4_;
            fVar205 = fVar244 + auVar17._0_4_;
            fVar246 = local_2780._4_4_;
            fVar210 = fVar246 + auVar17._4_4_;
            fVar247 = local_2780._8_4_;
            fVar211 = fVar247 + auVar17._8_4_;
            fVar248 = local_2780._12_4_;
            fVar212 = fVar248 + auVar17._12_4_;
            fVar249 = local_2780._16_4_;
            fVar213 = fVar249 + auVar17._16_4_;
            fVar250 = local_2780._20_4_;
            fVar214 = fVar250 + auVar17._20_4_;
            fVar251 = local_2780._24_4_;
            fVar215 = fVar251 + auVar17._24_4_;
            fVar219 = local_27e0._0_4_;
            fVar222 = local_27e0._4_4_;
            auVar29._4_4_ = fVar222 * fVar170;
            auVar29._0_4_ = fVar219 * fVar163;
            fVar223 = local_27e0._8_4_;
            auVar29._8_4_ = fVar223 * fVar172;
            fVar224 = local_27e0._12_4_;
            auVar29._12_4_ = fVar224 * fVar174;
            fVar225 = local_27e0._16_4_;
            auVar29._16_4_ = fVar225 * fVar176;
            fVar226 = local_27e0._20_4_;
            auVar29._20_4_ = fVar226 * fVar178;
            fVar227 = local_27e0._24_4_;
            auVar29._24_4_ = fVar227 * fVar180;
            auVar29._28_4_ = fVar125 + fVar138;
            auVar130 = _local_2820;
            auVar30._4_4_ = fVar210 * fVar101;
            auVar30._0_4_ = fVar205 * fVar95;
            auVar30._8_4_ = fVar211 * fVar102;
            auVar30._12_4_ = fVar212 * fVar121;
            auVar30._16_4_ = fVar213 * fVar122;
            auVar30._20_4_ = fVar214 * fVar123;
            auVar30._24_4_ = fVar215 * fVar124;
            auVar30._28_4_ = uVar3;
            auVar21 = vsubps_avx(auVar30,auVar29);
            auVar31._4_4_ = fVar232 * fVar210;
            auVar31._0_4_ = fVar228 * fVar205;
            auVar31._8_4_ = fVar234 * fVar211;
            auVar31._12_4_ = fVar236 * fVar212;
            auVar31._16_4_ = fVar238 * fVar213;
            auVar31._20_4_ = fVar240 * fVar214;
            auVar31._24_4_ = fVar242 * fVar215;
            auVar31._28_4_ = local_2780._28_4_ + auVar17._28_4_;
            auVar32._4_4_ = fVar222 * fVar156;
            auVar32._0_4_ = fVar219 * fVar144;
            auVar32._8_4_ = fVar223 * fVar158;
            auVar32._12_4_ = fVar224 * fVar159;
            auVar32._16_4_ = fVar225 * fVar160;
            auVar32._20_4_ = fVar226 * fVar161;
            auVar32._24_4_ = fVar227 * fVar162;
            auVar32._28_4_ = auVar18._28_4_ + fVar104;
            auVar108 = vsubps_avx(auVar32,auVar31);
            local_2a20._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_291c = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_2980 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fStack_297c = local_2980;
            fStack_2978 = local_2980;
            fStack_2974 = local_2980;
            fStack_2970 = local_2980;
            fStack_296c = local_2980;
            fStack_2968 = local_2980;
            fStack_2964 = local_2980;
            local_28a0._0_4_ =
                 auVar20._0_4_ * local_2980 +
                 (float)local_2a20._4_4_ * auVar21._0_4_ + fStack_291c * auVar108._0_4_;
            local_28a0._4_4_ =
                 auVar20._4_4_ * local_2980 +
                 (float)local_2a20._4_4_ * auVar21._4_4_ + fStack_291c * auVar108._4_4_;
            fStack_2898 = auVar20._8_4_ * local_2980 +
                          (float)local_2a20._4_4_ * auVar21._8_4_ + fStack_291c * auVar108._8_4_;
            fStack_2894 = auVar20._12_4_ * local_2980 +
                          (float)local_2a20._4_4_ * auVar21._12_4_ + fStack_291c * auVar108._12_4_;
            register0x00001490 =
                 auVar20._16_4_ * local_2980 +
                 (float)local_2a20._4_4_ * auVar21._16_4_ + fStack_291c * auVar108._16_4_;
            register0x00001494 =
                 auVar20._20_4_ * local_2980 +
                 (float)local_2a20._4_4_ * auVar21._20_4_ + fStack_291c * auVar108._20_4_;
            register0x00001498 =
                 auVar20._24_4_ * local_2980 +
                 (float)local_2a20._4_4_ * auVar21._24_4_ + fStack_291c * auVar108._24_4_;
            register0x0000149c = auVar21._28_4_ + auVar21._28_4_ + auVar108._28_4_;
            _local_2840 = vsubps_avx(local_27a0,auVar129);
            local_2860 = vsubps_avx(local_27c0,auVar16);
            fVar163 = fVar4 + auVar129._0_4_;
            fVar170 = fVar13 + auVar129._4_4_;
            fVar172 = fVar14 + auVar129._8_4_;
            fVar174 = fVar15 + auVar129._12_4_;
            fVar176 = fVar103 + auVar129._16_4_;
            fVar178 = fVar112 + auVar129._20_4_;
            fVar180 = fVar113 + auVar129._24_4_;
            fVar158 = fVar254 + auVar16._0_4_;
            fVar159 = fVar256 + auVar16._4_4_;
            fVar160 = fVar257 + auVar16._8_4_;
            fVar161 = fVar258 + auVar16._12_4_;
            fVar162 = fVar259 + auVar16._16_4_;
            fVar205 = fVar260 + auVar16._20_4_;
            fVar210 = fVar261 + auVar16._24_4_;
            fVar229 = local_2860._0_4_;
            fVar233 = local_2860._4_4_;
            auVar33._4_4_ = fVar233 * fVar170;
            auVar33._0_4_ = fVar229 * fVar163;
            fVar235 = local_2860._8_4_;
            auVar33._8_4_ = fVar235 * fVar172;
            fVar237 = local_2860._12_4_;
            auVar33._12_4_ = fVar237 * fVar174;
            fVar239 = local_2860._16_4_;
            auVar33._16_4_ = fVar239 * fVar176;
            fVar241 = local_2860._20_4_;
            auVar33._20_4_ = fVar241 * fVar178;
            fVar243 = local_2860._24_4_;
            auVar33._24_4_ = fVar243 * fVar180;
            auVar33._28_4_ = fVar125;
            fVar189 = local_2840._0_4_;
            fVar193 = local_2840._4_4_;
            auVar34._4_4_ = fVar193 * fVar159;
            auVar34._0_4_ = fVar189 * fVar158;
            fVar195 = local_2840._8_4_;
            auVar34._8_4_ = fVar195 * fVar160;
            fVar197 = local_2840._12_4_;
            auVar34._12_4_ = fVar197 * fVar161;
            fVar199 = local_2840._16_4_;
            auVar34._16_4_ = fVar199 * fVar162;
            fVar201 = local_2840._20_4_;
            auVar34._20_4_ = fVar201 * fVar205;
            fVar203 = local_2840._24_4_;
            auVar34._24_4_ = fVar203 * fVar210;
            auVar34._28_4_ = fVar104;
            auVar20 = vsubps_avx(auVar34,auVar33);
            auVar21 = vsubps_avx(local_2780,auVar107);
            fVar144 = auVar21._0_4_;
            fVar156 = auVar21._4_4_;
            auVar35._4_4_ = fVar156 * fVar159;
            auVar35._0_4_ = fVar144 * fVar158;
            fVar158 = auVar21._8_4_;
            auVar35._8_4_ = fVar158 * fVar160;
            fVar159 = auVar21._12_4_;
            auVar35._12_4_ = fVar159 * fVar161;
            fVar160 = auVar21._16_4_;
            auVar35._16_4_ = fVar160 * fVar162;
            fVar161 = auVar21._20_4_;
            auVar35._20_4_ = fVar161 * fVar205;
            fVar162 = auVar21._24_4_;
            auVar35._24_4_ = fVar162 * fVar210;
            auVar35._28_4_ = fVar125 + auVar16._28_4_;
            fVar205 = fVar244 + auVar107._0_4_;
            fVar210 = fVar246 + auVar107._4_4_;
            fVar211 = fVar247 + auVar107._8_4_;
            fVar212 = fVar248 + auVar107._12_4_;
            fVar213 = fVar249 + auVar107._16_4_;
            fVar214 = fVar250 + auVar107._20_4_;
            fVar215 = fVar251 + auVar107._24_4_;
            fVar216 = local_2780._28_4_ + auVar107._28_4_;
            auVar36._4_4_ = fVar233 * fVar210;
            auVar36._0_4_ = fVar229 * fVar205;
            auVar36._8_4_ = fVar235 * fVar211;
            auVar36._12_4_ = fVar237 * fVar212;
            auVar36._16_4_ = fVar239 * fVar213;
            auVar36._20_4_ = fVar241 * fVar214;
            auVar36._24_4_ = fVar243 * fVar215;
            auVar36._28_4_ = local_2860._28_4_;
            auVar21 = vsubps_avx(auVar36,auVar35);
            auVar37._4_4_ = fVar193 * fVar210;
            auVar37._0_4_ = fVar189 * fVar205;
            auVar37._8_4_ = fVar195 * fVar211;
            auVar37._12_4_ = fVar197 * fVar212;
            auVar37._16_4_ = fVar199 * fVar213;
            auVar37._20_4_ = fVar201 * fVar214;
            auVar37._24_4_ = fVar203 * fVar215;
            auVar37._28_4_ = fVar216;
            auVar38._4_4_ = fVar156 * fVar170;
            auVar38._0_4_ = fVar144 * fVar163;
            auVar38._8_4_ = fVar158 * fVar172;
            auVar38._12_4_ = fVar159 * fVar174;
            auVar38._16_4_ = fVar160 * fVar176;
            auVar38._20_4_ = fVar161 * fVar178;
            auVar38._24_4_ = fVar162 * fVar180;
            auVar38._28_4_ = fVar104 + auVar129._28_4_;
            auVar108 = vsubps_avx(auVar38,auVar37);
            local_26c0._0_4_ =
                 local_2980 * auVar20._0_4_ +
                 (float)local_2a20._4_4_ * auVar21._0_4_ + fStack_291c * auVar108._0_4_;
            local_26c0._4_4_ =
                 local_2980 * auVar20._4_4_ +
                 (float)local_2a20._4_4_ * auVar21._4_4_ + fStack_291c * auVar108._4_4_;
            local_26c0._8_4_ =
                 local_2980 * auVar20._8_4_ +
                 (float)local_2a20._4_4_ * auVar21._8_4_ + fStack_291c * auVar108._8_4_;
            local_26c0._12_4_ =
                 local_2980 * auVar20._12_4_ +
                 (float)local_2a20._4_4_ * auVar21._12_4_ + fStack_291c * auVar108._12_4_;
            local_26c0._16_4_ =
                 local_2980 * auVar20._16_4_ +
                 (float)local_2a20._4_4_ * auVar21._16_4_ + fStack_291c * auVar108._16_4_;
            local_26c0._20_4_ =
                 local_2980 * auVar20._20_4_ +
                 (float)local_2a20._4_4_ * auVar21._20_4_ + fStack_291c * auVar108._20_4_;
            local_26c0._24_4_ =
                 local_2980 * auVar20._24_4_ +
                 (float)local_2a20._4_4_ * auVar21._24_4_ + fStack_291c * auVar108._24_4_;
            local_26c0._28_4_ = auVar20._28_4_ + auVar21._28_4_ + auVar108._28_4_;
            _local_2880 = vsubps_avx(auVar107,auVar17);
            fVar180 = auVar107._0_4_ + auVar17._0_4_;
            fVar205 = auVar107._4_4_ + auVar17._4_4_;
            fVar210 = auVar107._8_4_ + auVar17._8_4_;
            fVar211 = auVar107._12_4_ + auVar17._12_4_;
            fVar212 = auVar107._16_4_ + auVar17._16_4_;
            fVar213 = auVar107._20_4_ + auVar17._20_4_;
            fVar214 = auVar107._24_4_ + auVar17._24_4_;
            fVar215 = auVar107._28_4_ + auVar17._28_4_;
            auVar20 = vsubps_avx(auVar129,auVar18);
            fVar104 = auVar129._0_4_ + auVar18._0_4_;
            fVar163 = auVar129._4_4_ + auVar18._4_4_;
            fVar170 = auVar129._8_4_ + auVar18._8_4_;
            fVar172 = auVar129._12_4_ + auVar18._12_4_;
            fVar174 = auVar129._16_4_ + auVar18._16_4_;
            fVar176 = auVar129._20_4_ + auVar18._20_4_;
            fVar178 = auVar129._24_4_ + auVar18._24_4_;
            auVar107 = vsubps_avx(auVar16,auVar19);
            auVar169 = ZEXT3264(auVar107);
            fVar125 = auVar16._0_4_ + auVar19._0_4_;
            fVar137 = auVar16._4_4_ + auVar19._4_4_;
            fVar139 = auVar16._8_4_ + auVar19._8_4_;
            fVar140 = auVar16._12_4_ + auVar19._12_4_;
            fVar141 = auVar16._16_4_ + auVar19._16_4_;
            fVar142 = auVar16._20_4_ + auVar19._20_4_;
            fVar143 = auVar16._24_4_ + auVar19._24_4_;
            fVar164 = auVar107._0_4_;
            fVar171 = auVar107._4_4_;
            auVar39._4_4_ = fVar171 * fVar163;
            auVar39._0_4_ = fVar164 * fVar104;
            fVar173 = auVar107._8_4_;
            auVar39._8_4_ = fVar173 * fVar170;
            fVar175 = auVar107._12_4_;
            auVar39._12_4_ = fVar175 * fVar172;
            fVar177 = auVar107._16_4_;
            auVar39._16_4_ = fVar177 * fVar174;
            fVar179 = auVar107._20_4_;
            auVar39._20_4_ = fVar179 * fVar176;
            fVar181 = auVar107._24_4_;
            auVar39._24_4_ = fVar181 * fVar178;
            auVar39._28_4_ = fVar138;
            fVar190 = auVar20._0_4_;
            fVar194 = auVar20._4_4_;
            auVar40._4_4_ = fVar194 * fVar137;
            auVar40._0_4_ = fVar190 * fVar125;
            fVar196 = auVar20._8_4_;
            auVar40._8_4_ = fVar196 * fVar139;
            fVar198 = auVar20._12_4_;
            auVar40._12_4_ = fVar198 * fVar140;
            fVar200 = auVar20._16_4_;
            auVar40._16_4_ = fVar200 * fVar141;
            fVar202 = auVar20._20_4_;
            auVar40._20_4_ = fVar202 * fVar142;
            fVar204 = auVar20._24_4_;
            auVar40._24_4_ = fVar204 * fVar143;
            auVar40._28_4_ = fVar216;
            auVar107 = vsubps_avx(auVar40,auVar39);
            fVar145 = local_2880._0_4_;
            fVar157 = local_2880._4_4_;
            auVar41._4_4_ = fVar157 * fVar137;
            auVar41._0_4_ = fVar145 * fVar125;
            fVar125 = local_2880._8_4_;
            auVar41._8_4_ = fVar125 * fVar139;
            fVar137 = local_2880._12_4_;
            auVar41._12_4_ = fVar137 * fVar140;
            fVar139 = local_2880._16_4_;
            auVar41._16_4_ = fVar139 * fVar141;
            fVar140 = local_2880._20_4_;
            auVar41._20_4_ = fVar140 * fVar142;
            fVar141 = local_2880._24_4_;
            auVar41._24_4_ = fVar141 * fVar143;
            auVar41._28_4_ = auVar16._28_4_ + fVar138;
            auVar42._4_4_ = fVar171 * fVar205;
            auVar42._0_4_ = fVar164 * fVar180;
            auVar42._8_4_ = fVar173 * fVar210;
            auVar42._12_4_ = fVar175 * fVar211;
            auVar42._16_4_ = fVar177 * fVar212;
            auVar42._20_4_ = fVar179 * fVar213;
            auVar42._24_4_ = fVar181 * fVar214;
            auVar42._28_4_ = fVar216;
            auVar16 = vsubps_avx(auVar42,auVar41);
            auVar43._4_4_ = fVar194 * fVar205;
            auVar43._0_4_ = fVar190 * fVar180;
            auVar43._8_4_ = fVar196 * fVar210;
            auVar43._12_4_ = fVar198 * fVar211;
            auVar43._16_4_ = fVar200 * fVar212;
            auVar43._20_4_ = fVar202 * fVar213;
            auVar43._24_4_ = fVar204 * fVar214;
            auVar43._28_4_ = fVar215;
            auVar19 = _local_2880;
            auVar44._4_4_ = fVar157 * fVar163;
            auVar44._0_4_ = fVar145 * fVar104;
            auVar44._8_4_ = fVar125 * fVar170;
            auVar44._12_4_ = fVar137 * fVar172;
            auVar44._16_4_ = fVar139 * fVar174;
            auVar44._20_4_ = fVar140 * fVar176;
            auVar44._24_4_ = fVar141 * fVar178;
            auVar44._28_4_ = auVar129._28_4_ + auVar18._28_4_;
            auVar129 = vsubps_avx(auVar44,auVar43);
            local_2920 = fStack_291c;
            fStack_2918 = fStack_291c;
            fStack_2914 = fStack_291c;
            fStack_2910 = fStack_291c;
            fStack_290c = fStack_291c;
            fStack_2908 = fStack_291c;
            fStack_2904 = fStack_291c;
            local_2a20._0_4_ = local_2a20._4_4_;
            fStack_2a18 = (float)local_2a20._4_4_;
            fStack_2a14 = (float)local_2a20._4_4_;
            fStack_2a10 = (float)local_2a20._4_4_;
            fStack_2a0c = (float)local_2a20._4_4_;
            fStack_2a08 = (float)local_2a20._4_4_;
            fStack_2a04 = (float)local_2a20._4_4_;
            auVar110._0_4_ =
                 local_2980 * auVar107._0_4_ +
                 (float)local_2a20._4_4_ * auVar16._0_4_ + fStack_291c * auVar129._0_4_;
            auVar110._4_4_ =
                 local_2980 * auVar107._4_4_ +
                 (float)local_2a20._4_4_ * auVar16._4_4_ + fStack_291c * auVar129._4_4_;
            auVar110._8_4_ =
                 local_2980 * auVar107._8_4_ +
                 (float)local_2a20._4_4_ * auVar16._8_4_ + fStack_291c * auVar129._8_4_;
            auVar110._12_4_ =
                 local_2980 * auVar107._12_4_ +
                 (float)local_2a20._4_4_ * auVar16._12_4_ + fStack_291c * auVar129._12_4_;
            auVar110._16_4_ =
                 local_2980 * auVar107._16_4_ +
                 (float)local_2a20._4_4_ * auVar16._16_4_ + fStack_291c * auVar129._16_4_;
            auVar110._20_4_ =
                 local_2980 * auVar107._20_4_ +
                 (float)local_2a20._4_4_ * auVar16._20_4_ + fStack_291c * auVar129._20_4_;
            auVar110._24_4_ =
                 local_2980 * auVar107._24_4_ +
                 (float)local_2a20._4_4_ * auVar16._24_4_ + fStack_291c * auVar129._24_4_;
            auVar110._28_4_ = fVar215 + fVar215 + auVar129._28_4_;
            local_26a0._0_4_ = auVar110._0_4_ + (float)local_28a0._0_4_ + local_26c0._0_4_;
            local_26a0._4_4_ = auVar110._4_4_ + (float)local_28a0._4_4_ + local_26c0._4_4_;
            local_26a0._8_4_ = auVar110._8_4_ + fStack_2898 + local_26c0._8_4_;
            local_26a0._12_4_ = auVar110._12_4_ + fStack_2894 + local_26c0._12_4_;
            local_26a0._16_4_ = auVar110._16_4_ + register0x00001490 + local_26c0._16_4_;
            local_26a0._20_4_ = auVar110._20_4_ + register0x00001494 + local_26c0._20_4_;
            local_26a0._24_4_ = auVar110._24_4_ + register0x00001498 + local_26c0._24_4_;
            local_26a0._28_4_ = auVar110._28_4_ + register0x0000149c + local_26c0._28_4_;
            auVar107 = vminps_avx(_local_28a0,local_26c0);
            auVar129 = vminps_avx(auVar107,auVar110);
            auVar133._8_4_ = 0x7fffffff;
            auVar133._0_8_ = 0x7fffffff7fffffff;
            auVar133._12_4_ = 0x7fffffff;
            auVar133._16_4_ = 0x7fffffff;
            auVar133._20_4_ = 0x7fffffff;
            auVar133._24_4_ = 0x7fffffff;
            auVar133._28_4_ = 0x7fffffff;
            auVar107 = vandps_avx(local_26a0,auVar133);
            fVar104 = auVar107._0_4_ * 1.1920929e-07;
            fVar138 = auVar107._4_4_ * 1.1920929e-07;
            auVar45._4_4_ = fVar138;
            auVar45._0_4_ = fVar104;
            fVar163 = auVar107._8_4_ * 1.1920929e-07;
            auVar45._8_4_ = fVar163;
            fVar170 = auVar107._12_4_ * 1.1920929e-07;
            auVar45._12_4_ = fVar170;
            fVar172 = auVar107._16_4_ * 1.1920929e-07;
            auVar45._16_4_ = fVar172;
            fVar174 = auVar107._20_4_ * 1.1920929e-07;
            auVar45._20_4_ = fVar174;
            fVar176 = auVar107._24_4_ * 1.1920929e-07;
            auVar45._24_4_ = fVar176;
            auVar45._28_4_ = 0x34000000;
            auVar136 = ZEXT3264(auVar45);
            auVar155 = ZEXT3264(CONCAT428(0x80000000,
                                          CONCAT424(0x80000000,
                                                    CONCAT420(0x80000000,
                                                              CONCAT416(0x80000000,
                                                                        CONCAT412(0x80000000,
                                                                                  CONCAT48(
                                                  0x80000000,0x8000000080000000)))))));
            auVar207._0_8_ = CONCAT44(fVar138,fVar104) ^ 0x8000000080000000;
            auVar207._8_4_ = -fVar163;
            auVar207._12_4_ = -fVar170;
            auVar207._16_4_ = -fVar172;
            auVar207._20_4_ = -fVar174;
            auVar207._24_4_ = -fVar176;
            auVar207._28_4_ = 0xb4000000;
            auVar129 = vcmpps_avx(auVar129,auVar207,5);
            auVar17 = vmaxps_avx(_local_28a0,local_26c0);
            auVar16 = vmaxps_avx(auVar17,auVar110);
            auVar16 = vcmpps_avx(auVar16,auVar45,2);
            auVar16 = vorps_avx(auVar129,auVar16);
            _local_28c0 = auVar118;
            if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0x7f,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar16 >> 0xbf,0) != '\0') ||
                (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar16[0x1f] < '\0') {
              auVar46._4_4_ = fVar193 * fVar101;
              auVar46._0_4_ = fVar189 * fVar95;
              auVar46._8_4_ = fVar195 * fVar102;
              auVar46._12_4_ = fVar197 * fVar121;
              auVar46._16_4_ = fVar199 * fVar122;
              auVar46._20_4_ = fVar201 * fVar123;
              auVar46._24_4_ = fVar203 * fVar124;
              auVar46._28_4_ = auVar129._28_4_;
              auVar47._4_4_ = fVar232 * fVar233;
              auVar47._0_4_ = fVar228 * fVar229;
              auVar47._8_4_ = fVar234 * fVar235;
              auVar47._12_4_ = fVar236 * fVar237;
              auVar47._16_4_ = fVar238 * fVar239;
              auVar47._20_4_ = fVar240 * fVar241;
              auVar47._24_4_ = fVar242 * fVar243;
              auVar47._28_4_ = 0x34000000;
              _local_28c0 = vsubps_avx(auVar47,auVar46);
              auVar48._4_4_ = fVar233 * fVar194;
              auVar48._0_4_ = fVar229 * fVar190;
              auVar48._8_4_ = fVar235 * fVar196;
              auVar48._12_4_ = fVar237 * fVar198;
              auVar48._16_4_ = fVar239 * fVar200;
              auVar48._20_4_ = fVar241 * fVar202;
              auVar48._24_4_ = fVar243 * fVar204;
              auVar48._28_4_ = auVar17._28_4_;
              auVar49._4_4_ = fVar193 * fVar171;
              auVar49._0_4_ = fVar189 * fVar164;
              auVar49._8_4_ = fVar195 * fVar173;
              auVar49._12_4_ = fVar197 * fVar175;
              auVar49._16_4_ = fVar199 * fVar177;
              auVar49._20_4_ = fVar201 * fVar179;
              auVar49._24_4_ = fVar203 * fVar181;
              auVar49._28_4_ = auVar107._28_4_;
              auVar18 = vsubps_avx(auVar49,auVar48);
              auVar153._8_4_ = 0x7fffffff;
              auVar153._0_8_ = 0x7fffffff7fffffff;
              auVar153._12_4_ = 0x7fffffff;
              auVar153._16_4_ = 0x7fffffff;
              auVar153._20_4_ = 0x7fffffff;
              auVar153._24_4_ = 0x7fffffff;
              auVar153._28_4_ = 0x7fffffff;
              auVar155 = ZEXT3264(auVar153);
              auVar129 = vandps_avx(auVar46,auVar153);
              auVar17 = vandps_avx(auVar48,auVar153);
              auVar129 = vcmpps_avx(auVar129,auVar17,1);
              local_2680 = vblendvps_avx(auVar18,_local_28c0,auVar129);
              auVar50._4_4_ = fVar156 * fVar171;
              auVar50._0_4_ = fVar144 * fVar164;
              auVar50._8_4_ = fVar158 * fVar173;
              auVar50._12_4_ = fVar159 * fVar175;
              auVar50._16_4_ = fVar160 * fVar177;
              auVar50._20_4_ = fVar161 * fVar179;
              auVar50._24_4_ = fVar162 * fVar181;
              auVar50._28_4_ = auVar129._28_4_;
              auVar51._4_4_ = fVar156 * fVar101;
              auVar51._0_4_ = fVar144 * fVar95;
              auVar51._8_4_ = fVar158 * fVar102;
              auVar51._12_4_ = fVar159 * fVar121;
              auVar51._16_4_ = fVar160 * fVar122;
              auVar51._20_4_ = fVar161 * fVar123;
              auVar51._24_4_ = fVar162 * fVar124;
              auVar51._28_4_ = local_26a0._28_4_;
              auVar52._4_4_ = fVar222 * fVar233;
              auVar52._0_4_ = fVar219 * fVar229;
              auVar52._8_4_ = fVar223 * fVar235;
              auVar52._12_4_ = fVar224 * fVar237;
              auVar52._16_4_ = fVar225 * fVar239;
              auVar52._20_4_ = fVar226 * fVar241;
              auVar52._24_4_ = fVar227 * fVar243;
              auVar52._28_4_ = uStack_2804;
              auVar18 = vsubps_avx(auVar51,auVar52);
              auVar53._4_4_ = fVar233 * fVar157;
              auVar53._0_4_ = fVar229 * fVar145;
              auVar53._8_4_ = fVar235 * fVar125;
              auVar53._12_4_ = fVar237 * fVar137;
              auVar53._16_4_ = fVar239 * fVar139;
              auVar53._20_4_ = fVar241 * fVar140;
              auVar53._24_4_ = fVar243 * fVar141;
              auVar53._28_4_ = local_2860._28_4_;
              auVar21 = vsubps_avx(auVar53,auVar50);
              auVar129 = vandps_avx(auVar52,auVar153);
              auVar17 = vandps_avx(auVar50,auVar153);
              auVar129 = vcmpps_avx(auVar129,auVar17,1);
              local_2660 = vblendvps_avx(auVar21,auVar18,auVar129);
              auVar54._4_4_ = fVar193 * fVar157;
              auVar54._0_4_ = fVar189 * fVar145;
              auVar54._8_4_ = fVar195 * fVar125;
              auVar54._12_4_ = fVar197 * fVar137;
              auVar54._16_4_ = fVar199 * fVar139;
              auVar54._20_4_ = fVar201 * fVar140;
              auVar54._24_4_ = fVar203 * fVar141;
              auVar54._28_4_ = auVar129._28_4_;
              auVar55._4_4_ = fVar222 * fVar193;
              auVar55._0_4_ = fVar219 * fVar189;
              auVar55._8_4_ = fVar223 * fVar195;
              auVar55._12_4_ = fVar224 * fVar197;
              auVar55._16_4_ = fVar225 * fVar199;
              auVar55._20_4_ = fVar226 * fVar201;
              auVar55._24_4_ = fVar227 * fVar203;
              auVar55._28_4_ = auVar18._28_4_;
              auVar56._4_4_ = fVar232 * fVar156;
              auVar56._0_4_ = fVar228 * fVar144;
              auVar56._8_4_ = fVar234 * fVar158;
              auVar56._12_4_ = fVar236 * fVar159;
              auVar56._16_4_ = fVar238 * fVar160;
              auVar56._20_4_ = fVar240 * fVar161;
              auVar56._24_4_ = fVar242 * fVar162;
              auVar56._28_4_ = uStack_2864;
              auVar57._4_4_ = fVar156 * fVar194;
              auVar57._0_4_ = fVar144 * fVar190;
              auVar57._8_4_ = fVar158 * fVar196;
              auVar57._12_4_ = fVar159 * fVar198;
              auVar57._16_4_ = fVar160 * fVar200;
              auVar57._20_4_ = fVar161 * fVar202;
              auVar57._24_4_ = fVar162 * fVar204;
              auVar57._28_4_ = auVar20._28_4_;
              auVar18 = vsubps_avx(auVar55,auVar56);
              auVar20 = vsubps_avx(auVar57,auVar54);
              auVar129 = vandps_avx(auVar56,auVar153);
              auVar17 = vandps_avx(auVar54,auVar153);
              auVar17 = vcmpps_avx(auVar129,auVar17,1);
              local_2640 = vblendvps_avx(auVar20,auVar18,auVar17);
              auVar115 = vpackssdw_avx(auVar16._0_16_,auVar16._16_16_);
              fVar104 = local_2640._0_4_;
              fVar138 = local_2640._4_4_;
              fVar95 = local_2640._8_4_;
              fVar144 = local_2640._12_4_;
              fVar101 = local_2640._16_4_;
              fVar156 = local_2640._20_4_;
              fVar102 = local_2640._24_4_;
              fVar162 = local_2660._0_4_;
              fVar163 = local_2660._4_4_;
              fVar170 = local_2660._8_4_;
              fVar172 = local_2660._12_4_;
              fVar174 = local_2660._16_4_;
              fVar176 = local_2660._20_4_;
              fVar178 = local_2660._24_4_;
              fVar180 = local_2680._0_4_;
              fVar205 = local_2680._4_4_;
              fVar210 = local_2680._8_4_;
              fVar211 = local_2680._12_4_;
              fVar212 = local_2680._16_4_;
              fVar213 = local_2680._20_4_;
              fVar214 = local_2680._24_4_;
              fVar158 = fVar180 * local_2980 +
                        fVar162 * (float)local_2a20._4_4_ + fVar104 * fStack_291c;
              fVar121 = fVar205 * local_2980 +
                        fVar163 * (float)local_2a20._4_4_ + fVar138 * fStack_291c;
              fVar159 = fVar210 * local_2980 +
                        fVar170 * (float)local_2a20._4_4_ + fVar95 * fStack_291c;
              fVar122 = fVar211 * local_2980 +
                        fVar172 * (float)local_2a20._4_4_ + fVar144 * fStack_291c;
              fVar160 = fVar212 * local_2980 +
                        fVar174 * (float)local_2a20._4_4_ + fVar101 * fStack_291c;
              fVar123 = fVar213 * local_2980 +
                        fVar176 * (float)local_2a20._4_4_ + fVar156 * fStack_291c;
              fVar161 = fVar214 * local_2980 +
                        fVar178 * (float)local_2a20._4_4_ + fVar102 * fStack_291c;
              fVar124 = auVar18._28_4_ + auVar18._28_4_ + 0.0;
              auVar120._0_4_ = fVar158 + fVar158;
              auVar120._4_4_ = fVar121 + fVar121;
              auVar120._8_4_ = fVar159 + fVar159;
              auVar120._12_4_ = fVar122 + fVar122;
              auVar120._16_4_ = fVar160 + fVar160;
              auVar120._20_4_ = fVar123 + fVar123;
              auVar120._24_4_ = fVar161 + fVar161;
              auVar120._28_4_ = fVar124 + fVar124;
              auVar16 = vrcpps_avx(auVar120);
              fVar158 = fVar180 * fVar244 + fVar162 * fVar4 + fVar104 * fVar254;
              fVar121 = fVar205 * fVar246 + fVar163 * fVar13 + fVar138 * fVar256;
              fVar159 = fVar210 * fVar247 + fVar170 * fVar14 + fVar95 * fVar257;
              fVar122 = fVar211 * fVar248 + fVar172 * fVar15 + fVar144 * fVar258;
              fVar160 = fVar212 * fVar249 + fVar174 * fVar103 + fVar101 * fVar259;
              fVar123 = fVar213 * fVar250 + fVar176 * fVar112 + fVar156 * fVar260;
              fVar161 = fVar214 * fVar251 + fVar178 * fVar113 + fVar102 * fVar261;
              fVar4 = auVar16._0_4_;
              fVar13 = auVar16._4_4_;
              auVar58._4_4_ = auVar120._4_4_ * fVar13;
              auVar58._0_4_ = auVar120._0_4_ * fVar4;
              fVar14 = auVar16._8_4_;
              auVar58._8_4_ = auVar120._8_4_ * fVar14;
              fVar15 = auVar16._12_4_;
              auVar58._12_4_ = auVar120._12_4_ * fVar15;
              fVar103 = auVar16._16_4_;
              auVar58._16_4_ = auVar120._16_4_ * fVar103;
              fVar112 = auVar16._20_4_;
              auVar58._20_4_ = auVar120._20_4_ * fVar112;
              fVar113 = auVar16._24_4_;
              auVar58._24_4_ = auVar120._24_4_ * fVar113;
              auVar58._28_4_ = auVar129._28_4_;
              auVar208._8_4_ = 0x3f800000;
              auVar208._0_8_ = &DAT_3f8000003f800000;
              auVar208._12_4_ = 0x3f800000;
              auVar208._16_4_ = 0x3f800000;
              auVar208._20_4_ = 0x3f800000;
              auVar208._24_4_ = 0x3f800000;
              auVar208._28_4_ = 0x3f800000;
              auVar129 = vsubps_avx(auVar208,auVar58);
              uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar183._4_4_ = uVar3;
              auVar183._0_4_ = uVar3;
              auVar183._8_4_ = uVar3;
              auVar183._12_4_ = uVar3;
              auVar183._16_4_ = uVar3;
              auVar183._20_4_ = uVar3;
              auVar183._24_4_ = uVar3;
              auVar183._28_4_ = uVar3;
              local_2a20._4_4_ = (fVar121 + fVar121) * (fVar13 + fVar13 * auVar129._4_4_);
              local_2a20._0_4_ = (fVar158 + fVar158) * (fVar4 + fVar4 * auVar129._0_4_);
              fStack_2a18 = (fVar159 + fVar159) * (fVar14 + fVar14 * auVar129._8_4_);
              fStack_2a14 = (fVar122 + fVar122) * (fVar15 + fVar15 * auVar129._12_4_);
              fStack_2a10 = (fVar160 + fVar160) * (fVar103 + fVar103 * auVar129._16_4_);
              fStack_2a0c = (fVar123 + fVar123) * (fVar112 + fVar112 * auVar129._20_4_);
              fStack_2a08 = (fVar161 + fVar161) * (fVar113 + fVar113 * auVar129._24_4_);
              fStack_2a04 = 1.0;
              auVar129 = vcmpps_avx(auVar183,_local_2a20,2);
              fVar4 = (ray->super_RayK<1>).tfar;
              auVar168._4_4_ = fVar4;
              auVar168._0_4_ = fVar4;
              auVar168._8_4_ = fVar4;
              auVar168._12_4_ = fVar4;
              auVar168._16_4_ = fVar4;
              auVar168._20_4_ = fVar4;
              auVar168._24_4_ = fVar4;
              auVar168._28_4_ = fVar4;
              auVar16 = vcmpps_avx(_local_2a20,auVar168,2);
              auVar169 = ZEXT3264(auVar16);
              auVar129 = vandps_avx(auVar16,auVar129);
              auVar17 = vcmpps_avx(auVar120,_DAT_02020f00,4);
              auVar129 = vandps_avx(auVar129,auVar17);
              auVar128 = vpackssdw_avx(auVar129._0_16_,auVar129._16_16_);
              auVar115 = vpand_avx(auVar128,auVar115);
              auVar128 = vpmovsxwd_avx(auVar115);
              auVar105 = vpshufd_avx(auVar115,0xee);
              auVar105 = vpmovsxwd_avx(auVar105);
              auVar136 = ZEXT1664(auVar105);
              local_2620._16_16_ = auVar105;
              local_2620._0_16_ = auVar128;
              if ((((((((local_2620 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_2620 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2620 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_2620 >> 0x7f,0) != '\0') ||
                    (local_2620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar105 >> 0x3f,0) != '\0') ||
                  (local_2620 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar105[0xf] < '\0') {
                local_26e0 = _local_28a0;
                local_25c0 = _local_2a20;
                local_2540 = local_23e0;
                local_2900 = local_2620;
                auVar129 = vrcpps_avx(local_26a0);
                fVar4 = auVar129._0_4_;
                fVar13 = auVar129._4_4_;
                auVar59._4_4_ = local_26a0._4_4_ * fVar13;
                auVar59._0_4_ = local_26a0._0_4_ * fVar4;
                fVar14 = auVar129._8_4_;
                auVar59._8_4_ = local_26a0._8_4_ * fVar14;
                fVar15 = auVar129._12_4_;
                auVar59._12_4_ = local_26a0._12_4_ * fVar15;
                fVar103 = auVar129._16_4_;
                auVar59._16_4_ = local_26a0._16_4_ * fVar103;
                fVar112 = auVar129._20_4_;
                auVar59._20_4_ = local_26a0._20_4_ * fVar112;
                fVar113 = auVar129._24_4_;
                auVar59._24_4_ = local_26a0._24_4_ * fVar113;
                auVar59._28_4_ = auVar16._28_4_;
                auVar187._8_4_ = 0x3f800000;
                auVar187._0_8_ = &DAT_3f8000003f800000;
                auVar187._12_4_ = 0x3f800000;
                auVar187._16_4_ = 0x3f800000;
                auVar187._20_4_ = 0x3f800000;
                auVar187._24_4_ = 0x3f800000;
                auVar187._28_4_ = 0x3f800000;
                auVar16 = vsubps_avx(auVar187,auVar59);
                auVar134._0_4_ = fVar4 + fVar4 * auVar16._0_4_;
                auVar134._4_4_ = fVar13 + fVar13 * auVar16._4_4_;
                auVar134._8_4_ = fVar14 + fVar14 * auVar16._8_4_;
                auVar134._12_4_ = fVar15 + fVar15 * auVar16._12_4_;
                auVar134._16_4_ = fVar103 + fVar103 * auVar16._16_4_;
                auVar134._20_4_ = fVar112 + fVar112 * auVar16._20_4_;
                auVar134._24_4_ = fVar113 + fVar113 * auVar16._24_4_;
                auVar134._28_4_ = auVar129._28_4_ + auVar16._28_4_;
                auVar154._8_4_ = 0x219392ef;
                auVar154._0_8_ = 0x219392ef219392ef;
                auVar154._12_4_ = 0x219392ef;
                auVar154._16_4_ = 0x219392ef;
                auVar154._20_4_ = 0x219392ef;
                auVar154._24_4_ = 0x219392ef;
                auVar154._28_4_ = 0x219392ef;
                auVar129 = vcmpps_avx(auVar107,auVar154,5);
                auVar107 = vandps_avx(auVar129,auVar134);
                auVar60._4_4_ = (float)local_28a0._4_4_ * auVar107._4_4_;
                auVar60._0_4_ = (float)local_28a0._0_4_ * auVar107._0_4_;
                auVar60._8_4_ = fStack_2898 * auVar107._8_4_;
                auVar60._12_4_ = fStack_2894 * auVar107._12_4_;
                auVar60._16_4_ = register0x00001490 * auVar107._16_4_;
                auVar60._20_4_ = register0x00001494 * auVar107._20_4_;
                auVar60._24_4_ = register0x00001498 * auVar107._24_4_;
                auVar60._28_4_ = auVar129._28_4_;
                auVar129 = vminps_avx(auVar60,auVar187);
                auVar61._4_4_ = local_26c0._4_4_ * auVar107._4_4_;
                auVar61._0_4_ = local_26c0._0_4_ * auVar107._0_4_;
                auVar61._8_4_ = local_26c0._8_4_ * auVar107._8_4_;
                auVar61._12_4_ = local_26c0._12_4_ * auVar107._12_4_;
                auVar61._16_4_ = local_26c0._16_4_ * auVar107._16_4_;
                auVar61._20_4_ = local_26c0._20_4_ * auVar107._20_4_;
                auVar61._24_4_ = local_26c0._24_4_ * auVar107._24_4_;
                auVar61._28_4_ = auVar107._28_4_;
                auVar107 = vminps_avx(auVar61,auVar187);
                auVar16 = vsubps_avx(auVar187,auVar129);
                local_25e0 = vblendvps_avx(auVar107,auVar16,local_23e0);
                auVar107 = vsubps_avx(auVar187,auVar107);
                local_2600 = vblendvps_avx(auVar129,auVar107,local_23e0);
                auVar169 = ZEXT3264(local_2400);
                fVar4 = local_2400._0_4_;
                fVar13 = local_2400._4_4_;
                fVar14 = local_2400._8_4_;
                fVar15 = local_2400._12_4_;
                fVar103 = local_2400._16_4_;
                fVar112 = local_2400._20_4_;
                fVar113 = local_2400._24_4_;
                local_25a0[0] = fVar180 * fVar4;
                local_25a0[1] = fVar205 * fVar13;
                local_25a0[2] = fVar210 * fVar14;
                local_25a0[3] = fVar211 * fVar15;
                fStack_2590 = fVar212 * fVar103;
                fStack_258c = fVar213 * fVar112;
                fStack_2588 = fVar214 * fVar113;
                uStack_2584 = local_2600._28_4_;
                local_2580[0] = fVar162 * fVar4;
                local_2580[1] = fVar163 * fVar13;
                local_2580[2] = fVar170 * fVar14;
                local_2580[3] = fVar172 * fVar15;
                fStack_2570 = fVar174 * fVar103;
                fStack_256c = fVar176 * fVar112;
                fStack_2568 = fVar178 * fVar113;
                uStack_2564 = local_25e0._28_4_;
                local_2560[0] = fVar4 * fVar104;
                local_2560[1] = fVar13 * fVar138;
                local_2560[2] = fVar14 * fVar95;
                local_2560[3] = fVar15 * fVar144;
                fStack_2550 = fVar103 * fVar101;
                fStack_254c = fVar112 * fVar156;
                fStack_2548 = fVar113 * fVar102;
                uStack_2544 = local_2640._28_4_;
                auVar128 = vpmovzxwd_avx(auVar115);
                auVar97._0_16_ = vpslld_avx(auVar128,0x1f);
                auVar128 = vpunpckhwd_avx(auVar115,auVar115);
                auVar128 = vpslld_avx(auVar128,0x1f);
                auVar97._16_16_ = auVar128;
                auVar135._8_4_ = 0x7f800000;
                auVar135._0_8_ = 0x7f8000007f800000;
                auVar135._12_4_ = 0x7f800000;
                auVar135._16_4_ = 0x7f800000;
                auVar135._20_4_ = 0x7f800000;
                auVar135._24_4_ = 0x7f800000;
                auVar135._28_4_ = 0x7f800000;
                auVar107 = vblendvps_avx(auVar135,_local_2a20,auVar97);
                auVar129 = vshufps_avx(auVar107,auVar107,0xb1);
                auVar129 = vminps_avx(auVar107,auVar129);
                auVar16 = vshufpd_avx(auVar129,auVar129,5);
                auVar129 = vminps_avx(auVar129,auVar16);
                auVar16 = vperm2f128_avx(auVar129,auVar129,1);
                auVar155 = ZEXT3264(auVar16);
                auVar129 = vminps_avx(auVar129,auVar16);
                auVar107 = vcmpps_avx(auVar107,auVar129,0);
                auVar136 = ZEXT1664(auVar107._16_16_);
                auVar128 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
                auVar115 = vpand_avx(auVar128,auVar115);
                auVar128 = vpmovzxwd_avx(auVar115);
                auVar128 = vpslld_avx(auVar128,0x1f);
                auVar128 = vpsrad_avx(auVar128,0x1f);
                auVar115 = vpunpckhwd_avx(auVar115,auVar115);
                auVar115 = vpslld_avx(auVar115,0x1f);
                auVar115 = vpsrad_avx(auVar115,0x1f);
                auVar98._16_16_ = auVar115;
                auVar98._0_16_ = auVar128;
                if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar98 >> 0x7f,0) == '\0') &&
                      (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar115 >> 0x3f,0) == '\0') &&
                    (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar115[0xf]) {
                  auVar98 = local_2620;
                }
                uVar69 = vmovmskps_avx(auVar98);
                uVar70 = 0;
                _local_2880 = auVar19;
                _local_2820 = auVar130;
                _local_2760 = auVar63;
                _local_2750 = auVar64;
                _local_2740 = auVar65;
                _local_2730 = auVar66;
                _local_2720 = auVar67;
                _local_2710 = auVar68;
                if (uVar69 != 0) {
                  for (; (uVar69 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
                  }
                }
                do {
                  uVar75 = (ulong)uVar70;
                  uVar70 = *(uint *)((long)&local_23c0 + uVar75 * 4);
                  pGVar8 = (local_2a00->geometries).items[uVar70].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_2900 + uVar75 * 4) = 0;
                  }
                  else {
                    pRVar11 = context->args;
                    if ((pRVar11->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar4 = *(float *)(local_2600 + uVar75 * 4);
                      fVar13 = *(float *)(local_25e0 + uVar75 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_25c0 + uVar75 * 4);
                      (ray->Ng).field_0.field_0.x = local_25a0[uVar75];
                      (ray->Ng).field_0.field_0.y = local_2580[uVar75];
                      (ray->Ng).field_0.field_0.z = local_2560[uVar75];
                      ray->u = fVar4;
                      ray->v = fVar13;
                      ray->primID = *(uint *)((long)&local_2700 + uVar75 * 4);
                      ray->geomID = uVar70;
                      pRVar12 = context->user;
                      ray->instID[0] = pRVar12->instID[0];
                      ray->instPrimID[0] = pRVar12->instPrimID[0];
                      break;
                    }
                    local_29f8.context = context->user;
                    local_294c = local_2580[uVar75];
                    auVar136 = ZEXT464((uint)local_294c);
                    local_2948 = local_2560[uVar75];
                    auVar155 = ZEXT464((uint)local_2948);
                    local_2950 = local_25a0[uVar75];
                    local_2944 = *(undefined4 *)(local_2600 + uVar75 * 4);
                    local_2940 = *(undefined4 *)(local_25e0 + uVar75 * 4);
                    local_293c = *(undefined4 *)((long)&local_2700 + uVar75 * 4);
                    local_2938 = uVar70;
                    local_2934 = (local_29f8.context)->instID[0];
                    local_2930 = (local_29f8.context)->instPrimID[0];
                    local_2980 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_25c0 + uVar75 * 4);
                    local_2a24 = -1;
                    local_29f8.valid = &local_2a24;
                    local_29f8.geometryUserPtr = pGVar8->userPtr;
                    local_29f8.ray = (RTCRayN *)ray;
                    local_29f8.hit = (RTCHitN *)&local_2950;
                    local_29f8.N = 1;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015be1c3:
                      if (pRVar11->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar11->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                          auVar136 = ZEXT1664(auVar136._0_16_);
                          auVar155 = ZEXT1664(auVar155._0_16_);
                          auVar169 = ZEXT1664(auVar169._0_16_);
                          (*pRVar11->filter)(&local_29f8);
                        }
                        if (*local_29f8.valid == 0) goto LAB_015be29e;
                      }
                      (((Vec3f *)((long)local_29f8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_29f8.hit;
                      (((Vec3f *)((long)local_29f8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_29f8.hit + 4);
                      (((Vec3f *)((long)local_29f8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_29f8.hit + 8);
                      *(float *)((long)local_29f8.ray + 0x3c) = *(float *)(local_29f8.hit + 0xc);
                      *(float *)((long)local_29f8.ray + 0x40) = *(float *)(local_29f8.hit + 0x10);
                      *(float *)((long)local_29f8.ray + 0x44) = *(float *)(local_29f8.hit + 0x14);
                      *(float *)((long)local_29f8.ray + 0x48) = *(float *)(local_29f8.hit + 0x18);
                      *(float *)((long)local_29f8.ray + 0x4c) = *(float *)(local_29f8.hit + 0x1c);
                      *(float *)((long)local_29f8.ray + 0x50) = *(float *)(local_29f8.hit + 0x20);
                    }
                    else {
                      auVar136 = ZEXT464((uint)local_294c);
                      auVar155 = ZEXT464((uint)local_2948);
                      auVar169 = ZEXT1664(auVar169._0_16_);
                      (*pGVar8->intersectionFilterN)(&local_29f8);
                      if (*local_29f8.valid != 0) goto LAB_015be1c3;
LAB_015be29e:
                      (ray->super_RayK<1>).tfar = local_2980;
                    }
                    *(undefined4 *)(local_2900 + uVar75 * 4) = 0;
                    fVar4 = (ray->super_RayK<1>).tfar;
                    auVar99._4_4_ = fVar4;
                    auVar99._0_4_ = fVar4;
                    auVar99._8_4_ = fVar4;
                    auVar99._12_4_ = fVar4;
                    auVar99._16_4_ = fVar4;
                    auVar99._20_4_ = fVar4;
                    auVar99._24_4_ = fVar4;
                    auVar99._28_4_ = fVar4;
                    auVar107 = vcmpps_avx(_local_2a20,auVar99,2);
                    local_2900 = vandps_avx(auVar107,local_2900);
                  }
                  if ((((((((local_2900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_2900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_2900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_2900 >> 0x7f,0) == '\0') &&
                        (local_2900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_2900 >> 0xbf,0) == '\0') &&
                      (local_2900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_2900[0x1f]) break;
                  BVHNIntersector1<8,16777232,true,embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,true>>>
                  ::intersect(&local_29f8);
                  uVar70 = (uint)local_29f8.valid;
                } while( true );
              }
            }
            local_2990 = local_2990 + 1;
          } while (local_2990 != local_29b0);
        }
        fVar4 = (ray->super_RayK<1>).tfar;
        auVar100 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,
                                                  CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,
                                                  fVar4))))))));
        auVar188 = ZEXT3264(local_2420);
        auVar192 = ZEXT3264(local_2440);
        auVar209 = ZEXT3264(local_2460);
        auVar218 = ZEXT3264(local_2480);
        auVar221 = ZEXT3264(local_24a0);
        auVar231 = ZEXT3264(local_24c0);
        auVar245 = ZEXT3264(local_24e0);
        auVar253 = ZEXT3264(local_2500);
        auVar255 = ZEXT3264(local_2520);
        auVar184 = ZEXT3264(local_28e0);
        uVar75 = local_29b8;
        uVar78 = local_29c0;
        uVar79 = local_29c8;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }